

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNvIntersectorK<8,4>::
intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
          (CurveNvIntersectorK<8,4> *this,Precalculations *pre,RayHitK<4> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  Vector *pVVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  byte bVar64;
  byte bVar65;
  ulong uVar66;
  ulong uVar67;
  byte bVar68;
  byte bVar69;
  long lVar70;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  bool bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar135;
  uint uVar136;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float pp;
  float fVar142;
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar177 [16];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar183;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar213;
  float fVar214;
  undefined1 auVar212 [32];
  undefined1 auVar215 [16];
  float fVar222;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar221;
  undefined1 in_ZMM4 [64];
  undefined1 auVar223 [16];
  float fVar227;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [32];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar234 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  float fVar240;
  undefined1 auVar241 [28];
  float fVar242;
  undefined1 auVar243 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  float fVar252;
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_870 [16];
  int local_854;
  uint local_850;
  uint local_84c;
  float local_848;
  float local_844;
  undefined1 local_840 [32];
  undefined1 *local_810;
  undefined8 local_808;
  undefined8 local_800;
  Precalculations *local_7f8;
  int *local_7f0;
  undefined4 local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  long local_758;
  RayQueryContext *local_750;
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined4 local_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar244 [16];
  
  bVar64 = *(byte *)((long)&context->scene + 1);
  uVar72 = (ulong)bVar64;
  lVar70 = (long)context + uVar72 * 0x19 + 0x16;
  fVar252 = *(float *)((long)context + uVar72 * 0x19 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x10)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416((uint)pre->ray_space[0].vy.field_0.m128[(long)ray]),0x20);
  auVar77 = vinsertps_avx(ZEXT416((uint)pre->ray_space[1].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x10);
  auVar83 = vinsertps_avx(auVar77,ZEXT416((uint)pre->ray_space[1].vz.field_0.m128[(long)ray]),0x20);
  auVar82 = vsubps_avx(auVar76,*(undefined1 (*) [16])((long)context + uVar72 * 0x19 + 6));
  fVar205 = fVar252 * auVar82._0_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 4 + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  fVar142 = fVar252 * auVar83._0_4_;
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 5 + 6);
  auVar87 = vpmovsxbd_avx2(auVar77);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar79);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 0xc + 6);
  auVar92 = vpmovsxbd_avx2(auVar74);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 0xd + 6);
  auVar88 = vpmovsxbd_avx2(auVar3);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 0x12 + 6);
  auVar93 = vpmovsxbd_avx2(auVar80);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 0x13 + 6);
  auVar94 = vpmovsxbd_avx2(auVar75);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)((long)&context->scene + uVar72 * 0x14 + 6);
  auVar96 = vpmovsxbd_avx2(auVar81);
  auVar95 = vcvtdq2ps_avx(auVar96);
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  auVar105._4_4_ = fVar142;
  auVar105._0_4_ = fVar142;
  auVar105._8_4_ = fVar142;
  auVar105._12_4_ = fVar142;
  auVar105._16_4_ = fVar142;
  auVar105._20_4_ = fVar142;
  auVar105._24_4_ = fVar142;
  auVar105._28_4_ = fVar142;
  auVar86 = ZEXT1632(CONCAT412(fVar252 * auVar83._12_4_,
                               CONCAT48(fVar252 * auVar83._8_4_,
                                        CONCAT44(fVar252 * auVar83._4_4_,fVar142))));
  auVar97 = vpermps_avx2(auVar107,auVar86);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar85 = vpermps_avx512vl(auVar84,auVar86);
  fVar142 = auVar85._0_4_;
  auVar226._0_4_ = fVar142 * auVar90._0_4_;
  fVar158 = auVar85._4_4_;
  auVar226._4_4_ = fVar158 * auVar90._4_4_;
  fVar160 = auVar85._8_4_;
  auVar226._8_4_ = fVar160 * auVar90._8_4_;
  fVar235 = auVar85._12_4_;
  auVar226._12_4_ = fVar235 * auVar90._12_4_;
  fVar236 = auVar85._16_4_;
  auVar226._16_4_ = fVar236 * auVar90._16_4_;
  fVar237 = auVar85._20_4_;
  auVar226._20_4_ = fVar237 * auVar90._20_4_;
  fVar213 = auVar85._24_4_;
  auVar226._28_36_ = in_ZMM4._28_36_;
  auVar226._24_4_ = fVar213 * auVar90._24_4_;
  auVar86._4_4_ = auVar88._4_4_ * fVar158;
  auVar86._0_4_ = auVar88._0_4_ * fVar142;
  auVar86._8_4_ = auVar88._8_4_ * fVar160;
  auVar86._12_4_ = auVar88._12_4_ * fVar235;
  auVar86._16_4_ = auVar88._16_4_ * fVar236;
  auVar86._20_4_ = auVar88._20_4_ * fVar237;
  auVar86._24_4_ = auVar88._24_4_ * fVar213;
  auVar86._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = fVar158 * auVar95._4_4_;
  auVar96._0_4_ = fVar142 * auVar95._0_4_;
  auVar96._8_4_ = fVar160 * auVar95._8_4_;
  auVar96._12_4_ = fVar235 * auVar95._12_4_;
  auVar96._16_4_ = fVar236 * auVar95._16_4_;
  auVar96._20_4_ = fVar237 * auVar95._20_4_;
  auVar96._24_4_ = fVar213 * auVar95._24_4_;
  auVar96._28_4_ = auVar85._28_4_;
  auVar76 = vfmadd231ps_fma(auVar226._0_32_,auVar97,auVar87);
  auVar77 = vfmadd231ps_fma(auVar86,auVar97,auVar92);
  auVar78 = vfmadd231ps_fma(auVar96,auVar94,auVar97);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar105,auVar89);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar105,auVar91);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar93,auVar105);
  auVar106._4_4_ = fVar205;
  auVar106._0_4_ = fVar205;
  auVar106._8_4_ = fVar205;
  auVar106._12_4_ = fVar205;
  auVar106._16_4_ = fVar205;
  auVar106._20_4_ = fVar205;
  auVar106._24_4_ = fVar205;
  auVar106._28_4_ = fVar205;
  auVar97 = ZEXT1632(CONCAT412(fVar252 * auVar82._12_4_,
                               CONCAT48(fVar252 * auVar82._8_4_,
                                        CONCAT44(fVar252 * auVar82._4_4_,fVar205))));
  auVar96 = vpermps_avx2(auVar107,auVar97);
  auVar86 = vpermps_avx512vl(auVar84,auVar97);
  fVar252 = auVar86._0_4_;
  fVar142 = auVar86._4_4_;
  auVar97._4_4_ = fVar142 * auVar90._4_4_;
  auVar97._0_4_ = fVar252 * auVar90._0_4_;
  fVar158 = auVar86._8_4_;
  auVar97._8_4_ = fVar158 * auVar90._8_4_;
  fVar160 = auVar86._12_4_;
  auVar97._12_4_ = fVar160 * auVar90._12_4_;
  fVar235 = auVar86._16_4_;
  auVar97._16_4_ = fVar235 * auVar90._16_4_;
  fVar236 = auVar86._20_4_;
  auVar97._20_4_ = fVar236 * auVar90._20_4_;
  fVar237 = auVar86._24_4_;
  auVar97._24_4_ = fVar237 * auVar90._24_4_;
  auVar97._28_4_ = auVar90._28_4_;
  auVar100._0_4_ = fVar252 * auVar88._0_4_;
  auVar100._4_4_ = fVar142 * auVar88._4_4_;
  auVar100._8_4_ = fVar158 * auVar88._8_4_;
  auVar100._12_4_ = fVar160 * auVar88._12_4_;
  auVar100._16_4_ = fVar235 * auVar88._16_4_;
  auVar100._20_4_ = fVar236 * auVar88._20_4_;
  auVar100._24_4_ = fVar237 * auVar88._24_4_;
  auVar100._28_4_ = 0;
  auVar88._4_4_ = fVar142 * auVar95._4_4_;
  auVar88._0_4_ = fVar252 * auVar95._0_4_;
  auVar88._8_4_ = fVar158 * auVar95._8_4_;
  auVar88._12_4_ = fVar160 * auVar95._12_4_;
  auVar88._16_4_ = fVar235 * auVar95._16_4_;
  auVar88._20_4_ = fVar236 * auVar95._20_4_;
  auVar88._24_4_ = fVar237 * auVar95._24_4_;
  auVar88._28_4_ = auVar95._28_4_;
  auVar79 = vfmadd231ps_fma(auVar97,auVar96,auVar87);
  auVar74 = vfmadd231ps_fma(auVar100,auVar96,auVar92);
  auVar3 = vfmadd231ps_fma(auVar88,auVar96,auVar94);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar106,auVar89);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar106,auVar91);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar106,auVar93);
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  auVar104._8_4_ = 0x219392ef;
  auVar104._0_8_ = 0x219392ef219392ef;
  auVar104._12_4_ = 0x219392ef;
  auVar104._16_4_ = 0x219392ef;
  auVar104._20_4_ = 0x219392ef;
  auVar104._24_4_ = 0x219392ef;
  auVar104._28_4_ = 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar76),auVar102);
  uVar66 = vcmpps_avx512vl(auVar89,auVar104,1);
  bVar71 = (bool)((byte)uVar66 & 1);
  auVar84._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._0_4_;
  bVar71 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._4_4_;
  bVar71 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._8_4_;
  bVar71 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar77),auVar102);
  uVar66 = vcmpps_avx512vl(auVar89,auVar104,1);
  bVar71 = (bool)((byte)uVar66 & 1);
  auVar85._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._0_4_;
  bVar71 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._4_4_;
  bVar71 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._8_4_;
  bVar71 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar77._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar78),auVar102);
  uVar66 = vcmpps_avx512vl(auVar89,auVar104,1);
  bVar71 = (bool)((byte)uVar66 & 1);
  auVar89._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._0_4_;
  bVar71 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._4_4_;
  bVar71 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._8_4_;
  bVar71 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar87 = vrcp14ps_avx512vl(auVar84);
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = 0x3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar103._16_4_ = 0x3f800000;
  auVar103._20_4_ = 0x3f800000;
  auVar103._24_4_ = 0x3f800000;
  auVar103._28_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar84,auVar87,auVar103);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar85);
  auVar77 = vfnmadd213ps_fma(auVar85,auVar87,auVar103);
  auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar89);
  auVar78 = vfnmadd213ps_fma(auVar89,auVar87,auVar103);
  auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar87,auVar87);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar72 * 7 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar79));
  auVar93._4_4_ = auVar76._4_4_ * auVar89._4_4_;
  auVar93._0_4_ = auVar76._0_4_ * auVar89._0_4_;
  auVar93._8_4_ = auVar76._8_4_ * auVar89._8_4_;
  auVar93._12_4_ = auVar76._12_4_ * auVar89._12_4_;
  auVar93._16_4_ = auVar89._16_4_ * 0.0;
  auVar93._20_4_ = auVar89._20_4_ * 0.0;
  auVar93._24_4_ = auVar89._24_4_ * 0.0;
  auVar93._28_4_ = auVar89._28_4_;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar72 * 9 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar79));
  auVar101._0_4_ = auVar76._0_4_ * auVar89._0_4_;
  auVar101._4_4_ = auVar76._4_4_ * auVar89._4_4_;
  auVar101._8_4_ = auVar76._8_4_ * auVar89._8_4_;
  auVar101._12_4_ = auVar76._12_4_ * auVar89._12_4_;
  auVar101._16_4_ = auVar89._16_4_ * 0.0;
  auVar101._20_4_ = auVar89._20_4_ * 0.0;
  auVar101._24_4_ = auVar89._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar72 * 0xe + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar74));
  auVar94._4_4_ = auVar77._4_4_ * auVar89._4_4_;
  auVar94._0_4_ = auVar77._0_4_ * auVar89._0_4_;
  auVar94._8_4_ = auVar77._8_4_ * auVar89._8_4_;
  auVar94._12_4_ = auVar77._12_4_ * auVar89._12_4_;
  auVar94._16_4_ = auVar89._16_4_ * 0.0;
  auVar94._20_4_ = auVar89._20_4_ * 0.0;
  auVar94._24_4_ = auVar89._24_4_ * 0.0;
  auVar94._28_4_ = auVar89._28_4_;
  auVar88 = vpbroadcastd_avx512vl();
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar64 * 0x10 + 6))
  ;
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar74));
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar72 * 0x15 + 6));
  auVar99._0_4_ = auVar77._0_4_ * auVar89._0_4_;
  auVar99._4_4_ = auVar77._4_4_ * auVar89._4_4_;
  auVar99._8_4_ = auVar77._8_4_ * auVar89._8_4_;
  auVar99._12_4_ = auVar77._12_4_ * auVar89._12_4_;
  auVar99._16_4_ = auVar89._16_4_ * 0.0;
  auVar99._20_4_ = auVar89._20_4_ * 0.0;
  auVar99._24_4_ = auVar89._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar89 = vcvtdq2ps_avx(auVar87);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar3));
  auVar95._4_4_ = auVar89._4_4_ * auVar78._4_4_;
  auVar95._0_4_ = auVar89._0_4_ * auVar78._0_4_;
  auVar95._8_4_ = auVar89._8_4_ * auVar78._8_4_;
  auVar95._12_4_ = auVar89._12_4_ * auVar78._12_4_;
  auVar95._16_4_ = auVar89._16_4_ * 0.0;
  auVar95._20_4_ = auVar89._20_4_ * 0.0;
  auVar95._24_4_ = auVar89._24_4_ * 0.0;
  auVar95._28_4_ = auVar89._28_4_;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar72 * 0x17 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar3));
  auVar98._0_4_ = auVar78._0_4_ * auVar89._0_4_;
  auVar98._4_4_ = auVar78._4_4_ * auVar89._4_4_;
  auVar98._8_4_ = auVar78._8_4_ * auVar89._8_4_;
  auVar98._12_4_ = auVar78._12_4_ * auVar89._12_4_;
  auVar98._16_4_ = auVar89._16_4_ * 0.0;
  auVar98._20_4_ = auVar89._20_4_ * 0.0;
  auVar98._24_4_ = auVar89._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar89 = vpminsd_avx2(auVar93,auVar101);
  auVar87 = vpminsd_avx2(auVar94,auVar99);
  auVar89 = vmaxps_avx(auVar89,auVar87);
  auVar87 = vpminsd_avx2(auVar95,auVar98);
  uVar166 = *(undefined4 *)((long)&pre->ray_space[0].vz.field_0 + (long)ray * 4);
  auVar90._4_4_ = uVar166;
  auVar90._0_4_ = uVar166;
  auVar90._8_4_ = uVar166;
  auVar90._12_4_ = uVar166;
  auVar90._16_4_ = uVar166;
  auVar90._20_4_ = uVar166;
  auVar90._24_4_ = uVar166;
  auVar90._28_4_ = uVar166;
  auVar87 = vmaxps_avx512vl(auVar87,auVar90);
  auVar89 = vmaxps_avx(auVar89,auVar87);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  auVar87._16_4_ = 0x3f7ffffa;
  auVar87._20_4_ = 0x3f7ffffa;
  auVar87._24_4_ = 0x3f7ffffa;
  auVar87._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar89,auVar87);
  auVar89 = vpmaxsd_avx2(auVar93,auVar101);
  auVar87 = vpmaxsd_avx2(auVar94,auVar99);
  auVar89 = vminps_avx(auVar89,auVar87);
  auVar87 = vpmaxsd_avx2(auVar95,auVar98);
  uVar166 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
  auVar91._4_4_ = uVar166;
  auVar91._0_4_ = uVar166;
  auVar91._8_4_ = uVar166;
  auVar91._12_4_ = uVar166;
  auVar91._16_4_ = uVar166;
  auVar91._20_4_ = uVar166;
  auVar91._24_4_ = uVar166;
  auVar91._28_4_ = uVar166;
  auVar87 = vminps_avx512vl(auVar87,auVar91);
  auVar89 = vminps_avx(auVar89,auVar87);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar92);
  uVar13 = vcmpps_avx512vl(local_300,auVar89,2);
  uVar15 = vpcmpgtd_avx512vl(auVar88,_DAT_01fb4ba0);
  local_748 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar13 & (byte)uVar15));
  local_550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_758 = lVar70;
  local_750 = context;
LAB_019d32e5:
  local_854 = 1;
  if (local_748 == 0) {
    return;
  }
  lVar17 = 0;
  for (uVar66 = local_748; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar17 = lVar17 + 1;
  }
  local_748 = local_748 - 1 & local_748;
  fVar252 = *(float *)((long)&context->scene + lVar17 * 4 + 6);
  uVar66 = (ulong)(uint)((int)lVar17 << 6);
  auVar76 = *(undefined1 (*) [16])(lVar70 + uVar66);
  if (local_748 != 0) {
    uVar67 = local_748 - 1 & local_748;
    for (uVar72 = local_748; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    }
    if (uVar67 != 0) {
      for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar77 = *(undefined1 (*) [16])(lVar70 + 0x10 + uVar66);
  auVar78 = *(undefined1 (*) [16])(lVar70 + 0x20 + uVar66);
  auVar79 = *(undefined1 (*) [16])(lVar70 + 0x30 + uVar66);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x10)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar3 = vinsertps_avx(auVar74,ZEXT416((uint)pre->ray_space[0].vy.field_0.m128[(long)ray]),0x28);
  uVar166 = *(undefined4 *)((long)&pre->ray_space[1].vx.field_0 + (long)ray * 4);
  auVar244._4_4_ = uVar166;
  auVar244._0_4_ = uVar166;
  auVar244._8_4_ = uVar166;
  auVar244._12_4_ = uVar166;
  local_460._16_4_ = uVar166;
  local_460._0_16_ = auVar244;
  local_460._20_4_ = uVar166;
  local_460._24_4_ = uVar166;
  local_460._28_4_ = uVar166;
  auVar248 = ZEXT3264(local_460);
  uVar166 = *(undefined4 *)((long)&pre->ray_space[1].vy.field_0 + (long)ray * 4);
  auVar249._4_4_ = uVar166;
  auVar249._0_4_ = uVar166;
  auVar249._8_4_ = uVar166;
  auVar249._12_4_ = uVar166;
  local_380._16_4_ = uVar166;
  local_380._0_16_ = auVar249;
  local_380._20_4_ = uVar166;
  local_380._24_4_ = uVar166;
  local_380._28_4_ = uVar166;
  auVar74 = vunpcklps_avx(auVar244,auVar249);
  fVar142 = *(float *)((long)&pre->ray_space[1].vz.field_0 + (long)ray * 4);
  auVar250._4_4_ = fVar142;
  auVar250._0_4_ = fVar142;
  auVar250._8_4_ = fVar142;
  auVar250._12_4_ = fVar142;
  local_480._16_4_ = fVar142;
  local_480._0_16_ = auVar250;
  local_480._20_4_ = fVar142;
  local_480._24_4_ = fVar142;
  local_480._28_4_ = fVar142;
  local_6f0 = vinsertps_avx(auVar74,auVar250,0x28);
  auVar238 = ZEXT1664(local_6f0);
  auVar82._0_4_ = auVar76._0_4_ + auVar77._0_4_ + auVar78._0_4_ + auVar79._0_4_;
  auVar82._4_4_ = auVar76._4_4_ + auVar77._4_4_ + auVar78._4_4_ + auVar79._4_4_;
  auVar82._8_4_ = auVar76._8_4_ + auVar77._8_4_ + auVar78._8_4_ + auVar79._8_4_;
  auVar82._12_4_ = auVar76._12_4_ + auVar77._12_4_ + auVar78._12_4_ + auVar79._12_4_;
  auVar83._8_4_ = 0x3e800000;
  auVar83._0_8_ = 0x3e8000003e800000;
  auVar83._12_4_ = 0x3e800000;
  auVar74 = vmulps_avx512vl(auVar82,auVar83);
  auVar74 = vsubps_avx(auVar74,auVar3);
  auVar74 = vdpps_avx(auVar74,local_6f0,0x7f);
  fVar160 = *(float *)((long)&context->scene + 2);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  fVar158 = pre->ray_space[0].vz.field_0.m128[(long)ray];
  auVar243 = ZEXT464((uint)fVar158);
  auVar228._4_12_ = ZEXT812(0) << 0x20;
  auVar228._0_4_ = local_700._0_4_;
  auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar228);
  auVar80 = vfnmadd213ss_fma(auVar75,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar74._0_4_ * auVar75._0_4_ * auVar80._0_4_;
  auVar229._4_4_ = local_2e0;
  auVar229._0_4_ = local_2e0;
  auVar229._8_4_ = local_2e0;
  auVar229._12_4_ = local_2e0;
  fStack_410 = local_2e0;
  _local_420 = auVar229;
  fStack_40c = local_2e0;
  fStack_408 = local_2e0;
  fStack_404 = local_2e0;
  auVar74 = vfmadd231ps_fma(auVar3,local_6f0,auVar229);
  auVar74 = vblendps_avx(auVar74,ZEXT816(0) << 0x40,8);
  auVar76 = vsubps_avx(auVar76,auVar74);
  auVar78 = vsubps_avx(auVar78,auVar74);
  auVar232 = ZEXT1664(auVar78);
  auVar77 = vsubps_avx(auVar77,auVar74);
  auVar234 = ZEXT1664(auVar77);
  auVar79 = vsubps_avx(auVar79,auVar74);
  auVar89 = vbroadcastss_avx512vl(auVar76);
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  local_680 = ZEXT1632(auVar76);
  auVar87 = vpermps_avx512vl(auVar109,local_680);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  auVar90 = vpermps_avx512vl(auVar110,local_680);
  auVar111._8_4_ = 3;
  auVar111._0_8_ = 0x300000003;
  auVar111._12_4_ = 3;
  auVar111._16_4_ = 3;
  auVar111._20_4_ = 3;
  auVar111._24_4_ = 3;
  auVar111._28_4_ = 3;
  auVar91 = vpermps_avx512vl(auVar111,local_680);
  auVar92 = vbroadcastss_avx512vl(auVar77);
  local_6c0 = ZEXT1632(auVar77);
  auVar88 = vpermps_avx512vl(auVar109,local_6c0);
  auVar93 = vpermps_avx512vl(auVar110,local_6c0);
  auVar94 = vpermps_avx512vl(auVar111,local_6c0);
  auVar95 = vbroadcastss_avx512vl(auVar78);
  local_6a0 = ZEXT1632(auVar78);
  auVar96 = vpermps_avx512vl(auVar109,local_6a0);
  local_840 = vpermps_avx512vl(auVar110,local_6a0);
  auVar254 = ZEXT3264(local_840);
  auVar97 = vpermps_avx512vl(auVar111,local_6a0);
  local_260 = vbroadcastss_avx512vl(auVar79);
  _local_6e0 = ZEXT1632(auVar79);
  local_240 = vpermps_avx512vl(auVar109,_local_6e0);
  local_2a0 = vpermps_avx2(auVar110,_local_6e0);
  local_2c0 = vpermps_avx2(auVar111,_local_6e0);
  auVar76 = vfmadd231ps_fma(ZEXT432((uint)(fVar142 * fVar142)),local_380,local_380);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_460,local_460);
  local_220._0_4_ = auVar76._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar108);
  local_650 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar158 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_530 = vpbroadcastd_avx512vl();
  uVar66 = 0;
  local_540 = vpbroadcastd_avx512vl();
  auVar76 = vsqrtss_avx(local_700,local_700);
  local_844 = auVar76._0_4_;
  auVar76 = vsqrtss_avx(local_700,local_700);
  local_848 = auVar76._0_4_;
  local_3b0 = ZEXT816(0x3f80000000000000);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar255 = ZEXT3264(auVar86);
  auVar226 = ZEXT3264(_DAT_01f7b040);
  local_280 = local_240;
  do {
    auVar76 = vmovshdup_avx(local_3b0);
    auVar76 = vsubps_avx(auVar76,local_3b0);
    local_720._0_4_ = auVar76._0_4_;
    fVar12 = local_720._0_4_ * 0.04761905;
    uVar166 = local_3b0._0_4_;
    local_780._4_4_ = uVar166;
    local_780._0_4_ = uVar166;
    local_780._8_4_ = uVar166;
    local_780._12_4_ = uVar166;
    local_780._16_4_ = uVar166;
    local_780._20_4_ = uVar166;
    local_780._24_4_ = uVar166;
    local_780._28_4_ = uVar166;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    auVar76 = vfmadd231ps_fma(local_780,local_720,auVar226._0_32_);
    auVar84 = vsubps_avx512vl(auVar255._0_32_,ZEXT1632(auVar76));
    fVar142 = auVar84._0_4_;
    fVar236 = auVar84._4_4_;
    fVar213 = auVar84._8_4_;
    fVar214 = auVar84._12_4_;
    fVar222 = auVar84._16_4_;
    fVar240 = auVar84._20_4_;
    fVar183 = auVar84._24_4_;
    fVar143 = fVar142 * fVar142 * fVar142;
    fVar159 = fVar236 * fVar236 * fVar236;
    auVar117._4_4_ = fVar159;
    auVar117._0_4_ = fVar143;
    fVar161 = fVar213 * fVar213 * fVar213;
    auVar117._8_4_ = fVar161;
    fVar162 = fVar214 * fVar214 * fVar214;
    auVar117._12_4_ = fVar162;
    fVar163 = fVar222 * fVar222 * fVar222;
    auVar117._16_4_ = fVar163;
    fVar164 = fVar240 * fVar240 * fVar240;
    auVar117._20_4_ = fVar164;
    fVar165 = fVar183 * fVar183 * fVar183;
    auVar117._24_4_ = fVar165;
    auVar117._28_4_ = local_720._0_4_;
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar85 = vmulps_avx512vl(auVar117,auVar86);
    fVar235 = auVar76._0_4_;
    fVar237 = auVar76._4_4_;
    fVar205 = auVar76._8_4_;
    fVar221 = auVar76._12_4_;
    fVar182 = fVar235 * fVar235 * fVar235;
    fVar202 = fVar237 * fVar237 * fVar237;
    fVar203 = fVar205 * fVar205 * fVar205;
    fVar204 = fVar221 * fVar221 * fVar221;
    auVar239._0_4_ = fVar235 * fVar142;
    auVar239._4_4_ = fVar237 * fVar236;
    auVar239._8_4_ = fVar205 * fVar213;
    auVar239._12_4_ = fVar221 * fVar214;
    auVar239._16_4_ = fVar222 * 0.0;
    auVar239._20_4_ = fVar240 * 0.0;
    auVar239._28_36_ = auVar238._28_36_;
    auVar239._24_4_ = fVar183 * 0.0;
    auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar204,CONCAT48(fVar203,CONCAT44(fVar202,fVar182))
                                                )),auVar86);
    fVar242 = auVar98._28_4_ + local_720._0_4_;
    fVar30 = auVar243._28_4_;
    fVar227 = fVar242 + fVar30 + auVar226._28_4_;
    auVar118._4_4_ = fVar159 * 0.16666667;
    auVar118._0_4_ = fVar143 * 0.16666667;
    auVar118._8_4_ = fVar161 * 0.16666667;
    auVar118._12_4_ = fVar162 * 0.16666667;
    auVar118._16_4_ = fVar163 * 0.16666667;
    auVar118._20_4_ = fVar164 * 0.16666667;
    auVar118._24_4_ = fVar165 * 0.16666667;
    auVar118._28_4_ = fVar242;
    auVar119._4_4_ =
         (auVar239._4_4_ * fVar236 * 12.0 + auVar239._4_4_ * fVar237 * 6.0 + fVar202 + auVar85._4_4_
         ) * 0.16666667;
    auVar119._0_4_ =
         (auVar239._0_4_ * fVar142 * 12.0 + auVar239._0_4_ * fVar235 * 6.0 + fVar182 + auVar85._0_4_
         ) * 0.16666667;
    auVar119._8_4_ =
         (auVar239._8_4_ * fVar213 * 12.0 + auVar239._8_4_ * fVar205 * 6.0 + fVar203 + auVar85._8_4_
         ) * 0.16666667;
    auVar119._12_4_ =
         (auVar239._12_4_ * fVar214 * 12.0 + auVar239._12_4_ * fVar221 * 6.0 +
         fVar204 + auVar85._12_4_) * 0.16666667;
    auVar119._16_4_ =
         (auVar239._16_4_ * fVar222 * 12.0 + auVar239._16_4_ * 0.0 * 6.0 + auVar85._16_4_ + 0.0) *
         0.16666667;
    auVar119._20_4_ =
         (auVar239._20_4_ * fVar240 * 12.0 + auVar239._20_4_ * 0.0 * 6.0 + auVar85._20_4_ + 0.0) *
         0.16666667;
    auVar119._24_4_ =
         (auVar239._24_4_ * fVar183 * 12.0 + auVar239._24_4_ * 0.0 * 6.0 + auVar85._24_4_ + 0.0) *
         0.16666667;
    auVar119._28_4_ = fVar30;
    auVar120._4_4_ =
         (auVar98._4_4_ + fVar159 + auVar239._4_4_ * fVar237 * 12.0 + auVar239._4_4_ * fVar236 * 6.0
         ) * 0.16666667;
    auVar120._0_4_ =
         (auVar98._0_4_ + fVar143 + auVar239._0_4_ * fVar235 * 12.0 + auVar239._0_4_ * fVar142 * 6.0
         ) * 0.16666667;
    auVar120._8_4_ =
         (auVar98._8_4_ + fVar161 + auVar239._8_4_ * fVar205 * 12.0 + auVar239._8_4_ * fVar213 * 6.0
         ) * 0.16666667;
    auVar120._12_4_ =
         (auVar98._12_4_ + fVar162 +
         auVar239._12_4_ * fVar221 * 12.0 + auVar239._12_4_ * fVar214 * 6.0) * 0.16666667;
    auVar120._16_4_ =
         (auVar98._16_4_ + fVar163 + auVar239._16_4_ * 0.0 * 12.0 + auVar239._16_4_ * fVar222 * 6.0)
         * 0.16666667;
    auVar120._20_4_ =
         (auVar98._20_4_ + fVar164 + auVar239._20_4_ * 0.0 * 12.0 + auVar239._20_4_ * fVar240 * 6.0)
         * 0.16666667;
    auVar120._24_4_ =
         (auVar98._24_4_ + fVar165 + auVar239._24_4_ * 0.0 * 12.0 + auVar239._24_4_ * fVar183 * 6.0)
         * 0.16666667;
    auVar120._28_4_ = auVar248._28_4_;
    fVar182 = fVar182 * 0.16666667;
    fVar202 = fVar202 * 0.16666667;
    fVar203 = fVar203 * 0.16666667;
    fVar204 = fVar204 * 0.16666667;
    auVar121._28_4_ = fVar227;
    auVar121._0_28_ = ZEXT1628(CONCAT412(fVar204,CONCAT48(fVar203,CONCAT44(fVar202,fVar182))));
    auVar85 = vmulps_avx512vl(local_260,auVar121);
    auVar98 = vmulps_avx512vl(local_280,auVar121);
    auVar124._4_4_ = local_2a0._4_4_ * fVar202;
    auVar124._0_4_ = local_2a0._0_4_ * fVar182;
    auVar124._8_4_ = local_2a0._8_4_ * fVar203;
    auVar124._12_4_ = local_2a0._12_4_ * fVar204;
    auVar124._16_4_ = local_2a0._16_4_ * 0.0;
    auVar124._20_4_ = local_2a0._20_4_ * 0.0;
    auVar124._24_4_ = local_2a0._24_4_ * 0.0;
    auVar124._28_4_ = local_720._0_4_;
    auVar125._4_4_ = local_2c0._4_4_ * fVar202;
    auVar125._0_4_ = local_2c0._0_4_ * fVar182;
    auVar125._8_4_ = local_2c0._8_4_ * fVar203;
    auVar125._12_4_ = local_2c0._12_4_ * fVar204;
    auVar125._16_4_ = local_2c0._16_4_ * 0.0;
    auVar125._20_4_ = local_2c0._20_4_ * 0.0;
    auVar125._24_4_ = local_2c0._24_4_ * 0.0;
    auVar125._28_4_ = fVar227;
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar120,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar120,auVar96);
    auVar99 = vfmadd231ps_avx512vl(auVar124,auVar120,auVar254._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar125,auVar97,auVar120);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar119,auVar92);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar119,auVar88);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar119,auVar93);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar119);
    auVar101 = vfmadd231ps_avx512vl(auVar85,auVar118,auVar89);
    auVar102 = vfmadd231ps_avx512vl(auVar98,auVar118,auVar87);
    auVar103 = vfmadd231ps_avx512vl(auVar99,auVar118,auVar90);
    auVar85 = vfmadd231ps_avx512vl(auVar100,auVar91,auVar118);
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar98 = vxorps_avx512vl(auVar84,auVar104);
    auVar99 = vxorps_avx512vl(ZEXT1632(auVar76),auVar104);
    auVar219._0_4_ = auVar99._0_4_ * fVar235;
    auVar219._4_4_ = auVar99._4_4_ * fVar237;
    auVar219._8_4_ = auVar99._8_4_ * fVar205;
    auVar219._12_4_ = auVar99._12_4_ * fVar221;
    auVar219._16_4_ = auVar99._16_4_ * 0.0;
    auVar219._20_4_ = auVar99._20_4_ * 0.0;
    auVar219._24_4_ = auVar99._24_4_ * 0.0;
    auVar219._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar239._0_32_,auVar86);
    auVar86 = vsubps_avx(auVar219,auVar99);
    auVar31._4_4_ = auVar98._4_4_ * fVar236 * 0.5;
    auVar31._0_4_ = auVar98._0_4_ * fVar142 * 0.5;
    auVar31._8_4_ = auVar98._8_4_ * fVar213 * 0.5;
    auVar31._12_4_ = auVar98._12_4_ * fVar214 * 0.5;
    auVar31._16_4_ = auVar98._16_4_ * fVar222 * 0.5;
    auVar31._20_4_ = auVar98._20_4_ * fVar240 * 0.5;
    auVar31._24_4_ = auVar98._24_4_ * fVar183 * 0.5;
    auVar31._28_4_ = auVar84._28_4_;
    auVar32._4_4_ = auVar86._4_4_ * 0.5;
    auVar32._0_4_ = auVar86._0_4_ * 0.5;
    auVar32._8_4_ = auVar86._8_4_ * 0.5;
    auVar32._12_4_ = auVar86._12_4_ * 0.5;
    auVar32._16_4_ = auVar86._16_4_ * 0.5;
    auVar32._20_4_ = auVar86._20_4_ * 0.5;
    auVar32._24_4_ = auVar86._24_4_ * 0.5;
    auVar32._28_4_ = auVar86._28_4_;
    auVar33._4_4_ = (auVar99._4_4_ + fVar236 * fVar236) * 0.5;
    auVar33._0_4_ = (auVar99._0_4_ + fVar142 * fVar142) * 0.5;
    auVar33._8_4_ = (auVar99._8_4_ + fVar213 * fVar213) * 0.5;
    auVar33._12_4_ = (auVar99._12_4_ + fVar214 * fVar214) * 0.5;
    auVar33._16_4_ = (auVar99._16_4_ + fVar222 * fVar222) * 0.5;
    auVar33._20_4_ = (auVar99._20_4_ + fVar240 * fVar240) * 0.5;
    auVar33._24_4_ = (auVar99._24_4_ + fVar183 * fVar183) * 0.5;
    auVar33._28_4_ = auVar99._28_4_ + auVar232._28_4_;
    fVar142 = fVar235 * fVar235 * 0.5;
    fVar235 = fVar237 * fVar237 * 0.5;
    fVar236 = fVar205 * fVar205 * 0.5;
    fVar237 = fVar221 * fVar221 * 0.5;
    auVar34._28_4_ = auVar234._28_4_;
    auVar34._0_28_ = ZEXT1628(CONCAT412(fVar237,CONCAT48(fVar236,CONCAT44(fVar235,fVar142))));
    auVar86 = vmulps_avx512vl(local_260,auVar34);
    auVar84 = vmulps_avx512vl(local_280,auVar34);
    auVar35._4_4_ = local_2a0._4_4_ * fVar235;
    auVar35._0_4_ = local_2a0._0_4_ * fVar142;
    auVar35._8_4_ = local_2a0._8_4_ * fVar236;
    auVar35._12_4_ = local_2a0._12_4_ * fVar237;
    auVar35._16_4_ = local_2a0._16_4_ * 0.0;
    auVar35._20_4_ = local_2a0._20_4_ * 0.0;
    auVar35._24_4_ = local_2a0._24_4_ * 0.0;
    auVar35._28_4_ = fVar30;
    auVar36._4_4_ = fVar235 * local_2c0._4_4_;
    auVar36._0_4_ = fVar142 * local_2c0._0_4_;
    auVar36._8_4_ = fVar236 * local_2c0._8_4_;
    auVar36._12_4_ = fVar237 * local_2c0._12_4_;
    auVar36._16_4_ = local_2c0._16_4_ * 0.0;
    auVar36._20_4_ = local_2c0._20_4_ * 0.0;
    auVar36._24_4_ = local_2c0._24_4_ * 0.0;
    auVar36._28_4_ = auVar234._28_4_;
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar33,auVar95);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar33,auVar96);
    auVar98 = vfmadd231ps_avx512vl(auVar35,auVar33,auVar254._0_32_);
    auVar76 = vfmadd231ps_fma(auVar36,auVar97,auVar33);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar32,auVar92);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar32,auVar88);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar32,auVar93);
    auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar94,auVar32);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar31,auVar89);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar31,auVar87);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar31,auVar90);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,auVar31);
    auVar37._4_4_ = auVar86._4_4_ * fVar12;
    auVar37._0_4_ = auVar86._0_4_ * fVar12;
    auVar37._8_4_ = auVar86._8_4_ * fVar12;
    auVar37._12_4_ = auVar86._12_4_ * fVar12;
    auVar37._16_4_ = auVar86._16_4_ * fVar12;
    auVar37._20_4_ = auVar86._20_4_ * fVar12;
    auVar37._24_4_ = auVar86._24_4_ * fVar12;
    auVar37._28_4_ = auVar97._28_4_;
    auVar248 = ZEXT3264(auVar37);
    auVar38._4_4_ = auVar84._4_4_ * fVar12;
    auVar38._0_4_ = auVar84._0_4_ * fVar12;
    auVar38._8_4_ = auVar84._8_4_ * fVar12;
    auVar38._12_4_ = auVar84._12_4_ * fVar12;
    auVar38._16_4_ = auVar84._16_4_ * fVar12;
    auVar38._20_4_ = auVar84._20_4_ * fVar12;
    auVar38._24_4_ = auVar84._24_4_ * fVar12;
    auVar38._28_4_ = 0x3e2aaaab;
    auVar39._4_4_ = auVar98._4_4_ * fVar12;
    auVar39._0_4_ = auVar98._0_4_ * fVar12;
    auVar39._8_4_ = auVar98._8_4_ * fVar12;
    auVar39._12_4_ = auVar98._12_4_ * fVar12;
    auVar39._16_4_ = auVar98._16_4_ * fVar12;
    auVar39._20_4_ = auVar98._20_4_ * fVar12;
    auVar39._24_4_ = auVar98._24_4_ * fVar12;
    auVar39._28_4_ = 0x40c00000;
    fVar142 = auVar99._0_4_ * fVar12;
    fVar235 = auVar99._4_4_ * fVar12;
    auVar40._4_4_ = fVar235;
    auVar40._0_4_ = fVar142;
    fVar236 = auVar99._8_4_ * fVar12;
    auVar40._8_4_ = fVar236;
    fVar237 = auVar99._12_4_ * fVar12;
    auVar40._12_4_ = fVar237;
    fVar213 = auVar99._16_4_ * fVar12;
    auVar40._16_4_ = fVar213;
    fVar205 = auVar99._20_4_ * fVar12;
    auVar40._20_4_ = fVar205;
    fVar214 = auVar99._24_4_ * fVar12;
    auVar40._24_4_ = fVar214;
    auVar40._28_4_ = fVar12;
    auVar76 = vxorps_avx512vl(auVar255._0_16_,auVar255._0_16_);
    auVar105 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar238 = ZEXT3264(auVar105);
    auVar106 = vpermt2ps_avx512vl(auVar102,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar98 = ZEXT1632(auVar76);
    auVar107 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar98);
    auVar243 = ZEXT3264(auVar107);
    auVar220._0_4_ = fVar142 + auVar85._0_4_;
    auVar220._4_4_ = fVar235 + auVar85._4_4_;
    auVar220._8_4_ = fVar236 + auVar85._8_4_;
    auVar220._12_4_ = fVar237 + auVar85._12_4_;
    auVar220._16_4_ = fVar213 + auVar85._16_4_;
    auVar220._20_4_ = fVar205 + auVar85._20_4_;
    auVar220._24_4_ = fVar214 + auVar85._24_4_;
    auVar220._28_4_ = fVar12 + auVar85._28_4_;
    auVar86 = vmaxps_avx(auVar85,auVar220);
    auVar84 = vminps_avx(auVar85,auVar220);
    auVar108 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,auVar98);
    auVar109 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar98);
    auVar110 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar98);
    auVar124 = ZEXT1632(auVar76);
    auVar111 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar124);
    auVar85 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar124);
    auVar112 = vsubps_avx512vl(auVar108,auVar85);
    auVar85 = vsubps_avx(auVar105,auVar101);
    auVar234 = ZEXT3264(auVar85);
    auVar98 = vsubps_avx(auVar106,auVar102);
    auVar232 = ZEXT3264(auVar98);
    auVar99 = vsubps_avx(auVar107,auVar103);
    auVar100 = vmulps_avx512vl(auVar98,auVar39);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar38,auVar99);
    auVar113 = vmulps_avx512vl(auVar99,auVar37);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar39,auVar85);
    auVar114 = vmulps_avx512vl(auVar85,auVar38);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar37,auVar98);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar100,auVar100);
    auVar100 = vmulps_avx512vl(auVar99,auVar99);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar98);
    auVar115 = vfmadd231ps_avx512vl(auVar100,auVar85,auVar85);
    auVar114 = vrcp14ps_avx512vl(auVar115);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar116 = vfnmadd213ps_avx512vl(auVar114,auVar115,auVar100);
    auVar114 = vfmadd132ps_avx512vl(auVar116,auVar114,auVar114);
    auVar113 = vmulps_avx512vl(auVar113,auVar114);
    auVar116 = vmulps_avx512vl(auVar98,auVar111);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar110,auVar99);
    auVar117 = vmulps_avx512vl(auVar99,auVar109);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar111,auVar85);
    auVar118 = vmulps_avx512vl(auVar85,auVar110);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar109,auVar98);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar116,auVar114);
    auVar113 = vmaxps_avx512vl(auVar113,auVar114);
    auVar113 = vsqrtps_avx512vl(auVar113);
    auVar114 = vmaxps_avx512vl(auVar112,auVar108);
    auVar86 = vmaxps_avx512vl(auVar86,auVar114);
    auVar116 = vaddps_avx512vl(auVar113,auVar86);
    auVar86 = vminps_avx512vl(auVar112,auVar108);
    auVar86 = vminps_avx(auVar84,auVar86);
    auVar86 = vsubps_avx512vl(auVar86,auVar113);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar116,auVar112);
    auVar113._8_4_ = 0x3f7ffffc;
    auVar113._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar113._12_4_ = 0x3f7ffffc;
    auVar113._16_4_ = 0x3f7ffffc;
    auVar113._20_4_ = 0x3f7ffffc;
    auVar113._24_4_ = 0x3f7ffffc;
    auVar113._28_4_ = 0x3f7ffffc;
    auVar86 = vmulps_avx512vl(auVar86,auVar113);
    auVar84 = vmulps_avx512vl(auVar84,auVar84);
    auVar108 = vrsqrt14ps_avx512vl(auVar115);
    auVar114._8_4_ = 0xbf000000;
    auVar114._0_8_ = 0xbf000000bf000000;
    auVar114._12_4_ = 0xbf000000;
    auVar114._16_4_ = 0xbf000000;
    auVar114._20_4_ = 0xbf000000;
    auVar114._24_4_ = 0xbf000000;
    auVar114._28_4_ = 0xbf000000;
    auVar112 = vmulps_avx512vl(auVar115,auVar114);
    fVar142 = auVar108._0_4_;
    fVar235 = auVar108._4_4_;
    fVar236 = auVar108._8_4_;
    fVar237 = auVar108._12_4_;
    fVar213 = auVar108._16_4_;
    fVar205 = auVar108._20_4_;
    fVar214 = auVar108._24_4_;
    auVar41._4_4_ = fVar235 * fVar235 * fVar235 * auVar112._4_4_;
    auVar41._0_4_ = fVar142 * fVar142 * fVar142 * auVar112._0_4_;
    auVar41._8_4_ = fVar236 * fVar236 * fVar236 * auVar112._8_4_;
    auVar41._12_4_ = fVar237 * fVar237 * fVar237 * auVar112._12_4_;
    auVar41._16_4_ = fVar213 * fVar213 * fVar213 * auVar112._16_4_;
    auVar41._20_4_ = fVar205 * fVar205 * fVar205 * auVar112._20_4_;
    auVar41._24_4_ = fVar214 * fVar214 * fVar214 * auVar112._24_4_;
    auVar41._28_4_ = auVar116._28_4_;
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar108 = vfmadd231ps_avx512vl(auVar41,auVar108,auVar115);
    auVar112 = vmulps_avx512vl(auVar85,auVar108);
    auVar113 = vmulps_avx512vl(auVar98,auVar108);
    auVar114 = vmulps_avx512vl(auVar99,auVar108);
    auVar115 = vsubps_avx512vl(auVar124,auVar101);
    auVar117 = vsubps_avx512vl(auVar124,auVar102);
    auVar118 = vsubps_avx512vl(auVar124,auVar103);
    auVar116 = vmulps_avx512vl(local_480,auVar118);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_380,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_460,auVar115);
    auVar119 = vmulps_avx512vl(auVar118,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar115);
    auVar120 = vmulps_avx512vl(local_480,auVar114);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar113,local_380);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar112,local_460);
    auVar114 = vmulps_avx512vl(auVar118,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar117,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar112);
    auVar113 = vmulps_avx512vl(auVar120,auVar120);
    auVar114 = vsubps_avx512vl(local_220,auVar113);
    auVar121 = vmulps_avx512vl(auVar120,auVar112);
    auVar116 = vsubps_avx512vl(auVar116,auVar121);
    auVar121 = vaddps_avx512vl(auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar112,auVar112);
    local_740 = vsubps_avx512vl(auVar119,auVar116);
    auVar84 = vsubps_avx512vl(local_740,auVar84);
    local_7a0 = vmulps_avx512vl(auVar121,auVar121);
    auVar116._8_4_ = 0x40800000;
    auVar116._0_8_ = 0x4080000040800000;
    auVar116._12_4_ = 0x40800000;
    auVar116._16_4_ = 0x40800000;
    auVar116._20_4_ = 0x40800000;
    auVar116._24_4_ = 0x40800000;
    auVar116._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar114,auVar116);
    auVar116 = vmulps_avx512vl(_local_7c0,auVar84);
    auVar116 = vsubps_avx512vl(local_7a0,auVar116);
    uVar72 = vcmpps_avx512vl(auVar116,auVar124,5);
    bVar64 = (byte)uVar72;
    if (bVar64 == 0) {
LAB_019d4012:
      auVar255 = ZEXT3264(auVar100);
      auVar226 = ZEXT3264(_DAT_01f7b040);
      auVar254 = ZEXT3264(local_840);
    }
    else {
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar119 = vaddps_avx512vl(auVar114,auVar114);
      local_7e0 = vrcp14ps_avx512vl(auVar119);
      auVar100 = vfnmadd213ps_avx512vl(local_7e0,auVar119,auVar100);
      auVar100 = vfmadd132ps_avx512vl(auVar100,local_7e0,local_7e0);
      _local_5a0 = vxorps_avx512vl(auVar121,auVar104);
      auVar104 = vsubps_avx512vl(_local_5a0,auVar116);
      local_580 = vmulps_avx512vl(auVar104,auVar100);
      auVar104 = vsubps_avx512vl(auVar116,auVar121);
      local_5c0 = vmulps_avx512vl(auVar104,auVar100);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar104 = vblendmps_avx512vl(auVar100,local_580);
      auVar122._0_4_ =
           (uint)(bVar64 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar100._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar71 * auVar104._4_4_ | (uint)!bVar71 * auVar100._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar71 * auVar104._8_4_ | (uint)!bVar71 * auVar100._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar71 * auVar104._12_4_ | (uint)!bVar71 * auVar100._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar71 * auVar104._16_4_ | (uint)!bVar71 * auVar100._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar71 * auVar104._20_4_ | (uint)!bVar71 * auVar100._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar71 * auVar104._24_4_ | (uint)!bVar71 * auVar100._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar122._28_4_ = (uint)bVar71 * auVar104._28_4_ | (uint)!bVar71 * auVar100._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar104 = vblendmps_avx512vl(auVar100,local_5c0);
      auVar123._0_4_ =
           (uint)(bVar64 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar100._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar71 * auVar104._4_4_ | (uint)!bVar71 * auVar100._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar71 * auVar104._8_4_ | (uint)!bVar71 * auVar100._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar71 * auVar104._12_4_ | (uint)!bVar71 * auVar100._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar71 * auVar104._16_4_ | (uint)!bVar71 * auVar100._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar71 * auVar104._20_4_ | (uint)!bVar71 * auVar100._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar71 * auVar104._24_4_ | (uint)!bVar71 * auVar100._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar123._28_4_ = (uint)bVar71 * auVar104._28_4_ | (uint)!bVar71 * auVar100._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar113,auVar100);
      local_5e0 = vmaxps_avx512vl(local_240,auVar100);
      auVar24._8_4_ = 0x36000000;
      auVar24._0_8_ = 0x3600000036000000;
      auVar24._12_4_ = 0x36000000;
      auVar24._16_4_ = 0x36000000;
      auVar24._20_4_ = 0x36000000;
      auVar24._24_4_ = 0x36000000;
      auVar24._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar24);
      vandps_avx512vl(auVar114,auVar100);
      uVar67 = vcmpps_avx512vl(local_600,local_600,1);
      uVar72 = uVar72 & uVar67;
      bVar69 = (byte)uVar72;
      if (bVar69 != 0) {
        uVar67 = vcmpps_avx512vl(auVar84,_DAT_01f7b000,2);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar104 = vblendmps_avx512vl(auVar84,auVar100);
        bVar68 = (byte)uVar67;
        uVar73 = (uint)(bVar68 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar68 & 1) * local_600._0_4_;
        bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
        uVar135 = (uint)bVar71 * auVar104._4_4_ | (uint)!bVar71 * local_600._4_4_;
        bVar71 = (bool)((byte)(uVar67 >> 2) & 1);
        uVar136 = (uint)bVar71 * auVar104._8_4_ | (uint)!bVar71 * local_600._8_4_;
        bVar71 = (bool)((byte)(uVar67 >> 3) & 1);
        uVar137 = (uint)bVar71 * auVar104._12_4_ | (uint)!bVar71 * local_600._12_4_;
        bVar71 = (bool)((byte)(uVar67 >> 4) & 1);
        uVar138 = (uint)bVar71 * auVar104._16_4_ | (uint)!bVar71 * local_600._16_4_;
        bVar71 = (bool)((byte)(uVar67 >> 5) & 1);
        uVar139 = (uint)bVar71 * auVar104._20_4_ | (uint)!bVar71 * local_600._20_4_;
        bVar71 = (bool)((byte)(uVar67 >> 6) & 1);
        uVar140 = (uint)bVar71 * auVar104._24_4_ | (uint)!bVar71 * local_600._24_4_;
        bVar71 = SUB81(uVar67 >> 7,0);
        uVar141 = (uint)bVar71 * auVar104._28_4_ | (uint)!bVar71 * local_600._28_4_;
        auVar122._0_4_ = (bVar69 & 1) * uVar73 | !(bool)(bVar69 & 1) * auVar122._0_4_;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar122._4_4_ = bVar71 * uVar135 | !bVar71 * auVar122._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar122._8_4_ = bVar71 * uVar136 | !bVar71 * auVar122._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar122._12_4_ = bVar71 * uVar137 | !bVar71 * auVar122._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar122._16_4_ = bVar71 * uVar138 | !bVar71 * auVar122._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar122._20_4_ = bVar71 * uVar139 | !bVar71 * auVar122._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar122._24_4_ = bVar71 * uVar140 | !bVar71 * auVar122._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar122._28_4_ = bVar71 * uVar141 | !bVar71 * auVar122._28_4_;
        auVar84 = vblendmps_avx512vl(auVar100,auVar84);
        bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar67 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar67 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar67 >> 6) & 1);
        bVar11 = SUB81(uVar67 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar69 & 1) *
             ((uint)(bVar68 & 1) * auVar84._0_4_ | !(bool)(bVar68 & 1) * uVar73) |
             !(bool)(bVar69 & 1) * auVar123._0_4_;
        bVar5 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar5 * ((uint)bVar71 * auVar84._4_4_ | !bVar71 * uVar135) |
             !bVar5 * auVar123._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar71 * ((uint)bVar6 * auVar84._8_4_ | !bVar6 * uVar136) |
             !bVar71 * auVar123._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar71 * ((uint)bVar7 * auVar84._12_4_ | !bVar7 * uVar137) |
             !bVar71 * auVar123._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar71 * ((uint)bVar8 * auVar84._16_4_ | !bVar8 * uVar138) |
             !bVar71 * auVar123._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar71 * ((uint)bVar9 * auVar84._20_4_ | !bVar9 * uVar139) |
             !bVar71 * auVar123._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar71 * ((uint)bVar10 * auVar84._24_4_ | !bVar10 * uVar140) |
             !bVar71 * auVar123._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar71 * ((uint)bVar11 * auVar84._28_4_ | !bVar11 * uVar141) |
             !bVar71 * auVar123._28_4_;
        bVar64 = (~bVar69 | bVar68) & bVar64;
      }
      if ((bVar64 & 0x7f) == 0) {
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar86);
        auVar226 = ZEXT3264(_DAT_01f7b040);
        auVar254 = ZEXT3264(local_840);
      }
      else {
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar104 = vxorps_avx512vl(auVar111,auVar84);
        auVar109 = vxorps_avx512vl(auVar109,auVar84);
        uVar73 = *(uint *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
        auVar226 = ZEXT464(uVar73);
        auVar110 = vxorps_avx512vl(auVar110,auVar84);
        auVar76 = vsubss_avx512f(ZEXT416(uVar73),ZEXT416((uint)local_650._0_4_));
        auVar100 = vbroadcastss_avx512vl(auVar76);
        auVar111 = vminps_avx512vl(auVar100,auVar123);
        auVar63._4_4_ = fStack_2dc;
        auVar63._0_4_ = local_2e0;
        auVar63._8_4_ = fStack_2d8;
        auVar63._12_4_ = fStack_2d4;
        auVar63._16_4_ = fStack_2d0;
        auVar63._20_4_ = fStack_2cc;
        auVar63._24_4_ = fStack_2c8;
        auVar63._28_4_ = fStack_2c4;
        auVar113 = vmaxps_avx512vl(auVar63,auVar122);
        auVar100 = vmulps_avx512vl(auVar39,auVar118);
        auVar100 = vfmadd213ps_avx512vl(auVar117,auVar38,auVar100);
        auVar76 = vfmadd213ps_fma(auVar115,auVar37,auVar100);
        auVar100 = vmulps_avx512vl(local_480,auVar39);
        auVar100 = vfmadd231ps_avx512vl(auVar100,local_380,auVar38);
        auVar114 = vfmadd231ps_avx512vl(auVar100,local_460,auVar37);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar114,auVar115);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar13 = vcmpps_avx512vl(auVar115,auVar116,1);
        auVar117 = vxorps_avx512vl(ZEXT1632(auVar76),auVar84);
        auVar118 = vrcp14ps_avx512vl(auVar114);
        auVar124 = vxorps_avx512vl(auVar114,auVar84);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar125 = vfnmadd213ps_avx512vl(auVar118,auVar114,auVar100);
        auVar76 = vfmadd132ps_fma(auVar125,auVar118,auVar118);
        fVar142 = auVar76._0_4_ * auVar117._0_4_;
        fVar235 = auVar76._4_4_ * auVar117._4_4_;
        auVar42._4_4_ = fVar235;
        auVar42._0_4_ = fVar142;
        fVar236 = auVar76._8_4_ * auVar117._8_4_;
        auVar42._8_4_ = fVar236;
        fVar237 = auVar76._12_4_ * auVar117._12_4_;
        auVar42._12_4_ = fVar237;
        fVar213 = auVar117._16_4_ * 0.0;
        auVar42._16_4_ = fVar213;
        fVar205 = auVar117._20_4_ * 0.0;
        auVar42._20_4_ = fVar205;
        fVar214 = auVar117._24_4_ * 0.0;
        auVar42._24_4_ = fVar214;
        auVar42._28_4_ = auVar117._28_4_;
        uVar15 = vcmpps_avx512vl(auVar114,auVar124,1);
        bVar69 = (byte)uVar13 | (byte)uVar15;
        auVar251._8_4_ = 0xff800000;
        auVar251._0_8_ = 0xff800000ff800000;
        auVar251._12_4_ = 0xff800000;
        auVar251._16_4_ = 0xff800000;
        auVar251._20_4_ = 0xff800000;
        auVar251._24_4_ = 0xff800000;
        auVar251._28_4_ = 0xff800000;
        auVar125 = vblendmps_avx512vl(auVar42,auVar251);
        auVar126._0_4_ =
             (uint)(bVar69 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar118._0_4_;
        bVar71 = (bool)(bVar69 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar71 * auVar125._4_4_ | (uint)!bVar71 * auVar118._4_4_;
        bVar71 = (bool)(bVar69 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar71 * auVar125._8_4_ | (uint)!bVar71 * auVar118._8_4_;
        bVar71 = (bool)(bVar69 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar71 * auVar125._12_4_ | (uint)!bVar71 * auVar118._12_4_;
        bVar71 = (bool)(bVar69 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar71 * auVar125._16_4_ | (uint)!bVar71 * auVar118._16_4_;
        bVar71 = (bool)(bVar69 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar71 * auVar125._20_4_ | (uint)!bVar71 * auVar118._20_4_;
        bVar71 = (bool)(bVar69 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar71 * auVar125._24_4_ | (uint)!bVar71 * auVar118._24_4_;
        auVar126._28_4_ =
             (uint)(bVar69 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar118._28_4_;
        auVar113 = vmaxps_avx512vl(auVar113,auVar126);
        auVar248 = ZEXT3264(auVar113);
        uVar15 = vcmpps_avx512vl(auVar114,auVar124,6);
        bVar69 = (byte)uVar13 | (byte)uVar15;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar127._0_4_ =
             (uint)(bVar69 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)fVar142;
        bVar71 = (bool)(bVar69 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar71 * auVar114._4_4_ | (uint)!bVar71 * (int)fVar235;
        bVar71 = (bool)(bVar69 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar71 * auVar114._8_4_ | (uint)!bVar71 * (int)fVar236;
        bVar71 = (bool)(bVar69 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar71 * auVar114._12_4_ | (uint)!bVar71 * (int)fVar237;
        bVar71 = (bool)(bVar69 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar71 * auVar114._16_4_ | (uint)!bVar71 * (int)fVar213;
        bVar71 = (bool)(bVar69 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar71 * auVar114._20_4_ | (uint)!bVar71 * (int)fVar205;
        bVar71 = (bool)(bVar69 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar71 * auVar114._24_4_ | (uint)!bVar71 * (int)fVar214;
        auVar127._28_4_ =
             (uint)(bVar69 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar117._28_4_;
        auVar117 = vminps_avx512vl(auVar111,auVar127);
        auVar76 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar76),auVar105);
        auVar106 = vsubps_avx512vl(ZEXT1632(auVar76),auVar106);
        auVar111 = ZEXT1632(auVar76);
        auVar107 = vsubps_avx512vl(auVar111,auVar107);
        auVar107 = vmulps_avx512vl(auVar107,auVar104);
        auVar106 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar106);
        auVar105 = vfmadd231ps_avx512vl(auVar106,auVar109,auVar105);
        auVar104 = vmulps_avx512vl(local_480,auVar104);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_380,auVar110);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_460,auVar109);
        vandps_avx512vl(auVar104,auVar115);
        uVar13 = vcmpps_avx512vl(auVar104,auVar116,1);
        auVar105 = vxorps_avx512vl(auVar105,auVar84);
        auVar106 = vrcp14ps_avx512vl(auVar104);
        auVar84 = vxorps_avx512vl(auVar104,auVar84);
        auVar243 = ZEXT3264(auVar84);
        auVar107 = vfnmadd213ps_avx512vl(auVar106,auVar104,auVar100);
        auVar76 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
        fVar142 = auVar76._0_4_ * auVar105._0_4_;
        fVar235 = auVar76._4_4_ * auVar105._4_4_;
        auVar43._4_4_ = fVar235;
        auVar43._0_4_ = fVar142;
        fVar236 = auVar76._8_4_ * auVar105._8_4_;
        auVar43._8_4_ = fVar236;
        fVar237 = auVar76._12_4_ * auVar105._12_4_;
        auVar43._12_4_ = fVar237;
        fVar213 = auVar105._16_4_ * 0.0;
        auVar43._16_4_ = fVar213;
        fVar205 = auVar105._20_4_ * 0.0;
        auVar43._20_4_ = fVar205;
        fVar214 = auVar105._24_4_ * 0.0;
        auVar43._24_4_ = fVar214;
        auVar43._28_4_ = auVar105._28_4_;
        uVar15 = vcmpps_avx512vl(auVar104,auVar84,1);
        bVar69 = (byte)uVar13 | (byte)uVar15;
        auVar107 = vblendmps_avx512vl(auVar43,auVar251);
        auVar128._0_4_ =
             (uint)(bVar69 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar106._0_4_;
        bVar71 = (bool)(bVar69 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar71 * auVar107._4_4_ | (uint)!bVar71 * auVar106._4_4_;
        bVar71 = (bool)(bVar69 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar71 * auVar107._8_4_ | (uint)!bVar71 * auVar106._8_4_;
        bVar71 = (bool)(bVar69 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar71 * auVar107._12_4_ | (uint)!bVar71 * auVar106._12_4_;
        bVar71 = (bool)(bVar69 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar71 * auVar107._16_4_ | (uint)!bVar71 * auVar106._16_4_;
        bVar71 = (bool)(bVar69 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar71 * auVar107._20_4_ | (uint)!bVar71 * auVar106._20_4_;
        bVar71 = (bool)(bVar69 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar71 * auVar107._24_4_ | (uint)!bVar71 * auVar106._24_4_;
        auVar128._28_4_ =
             (uint)(bVar69 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar106._28_4_;
        local_440 = vmaxps_avx(auVar113,auVar128);
        uVar15 = vcmpps_avx512vl(auVar104,auVar84,6);
        bVar69 = (byte)uVar13 | (byte)uVar15;
        auVar129._0_4_ =
             (uint)(bVar69 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)fVar142;
        bVar71 = (bool)(bVar69 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar71 * auVar114._4_4_ | (uint)!bVar71 * (int)fVar235;
        bVar71 = (bool)(bVar69 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar71 * auVar114._8_4_ | (uint)!bVar71 * (int)fVar236;
        bVar71 = (bool)(bVar69 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar71 * auVar114._12_4_ | (uint)!bVar71 * (int)fVar237;
        bVar71 = (bool)(bVar69 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar71 * auVar114._16_4_ | (uint)!bVar71 * (int)fVar213;
        bVar71 = (bool)(bVar69 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar71 * auVar114._20_4_ | (uint)!bVar71 * (int)fVar205;
        bVar71 = (bool)(bVar69 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar71 * auVar114._24_4_ | (uint)!bVar71 * (int)fVar214;
        auVar129._28_4_ =
             (uint)(bVar69 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar105._28_4_;
        local_340 = vminps_avx(auVar117,auVar129);
        auVar238 = ZEXT3264(local_340);
        uVar13 = vcmpps_avx512vl(local_440,local_340,2);
        bVar64 = bVar64 & 0x7f & (byte)uVar13;
        if (bVar64 == 0) goto LAB_019d4012;
        auVar84 = vmaxps_avx512vl(auVar111,auVar86);
        auVar86 = vfmadd213ps_avx512vl(local_580,auVar120,auVar112);
        fVar142 = auVar108._0_4_;
        fVar235 = auVar108._4_4_;
        auVar44._4_4_ = fVar235 * auVar86._4_4_;
        auVar44._0_4_ = fVar142 * auVar86._0_4_;
        fVar236 = auVar108._8_4_;
        auVar44._8_4_ = fVar236 * auVar86._8_4_;
        fVar237 = auVar108._12_4_;
        auVar44._12_4_ = fVar237 * auVar86._12_4_;
        fVar213 = auVar108._16_4_;
        auVar44._16_4_ = fVar213 * auVar86._16_4_;
        fVar205 = auVar108._20_4_;
        auVar44._20_4_ = fVar205 * auVar86._20_4_;
        fVar214 = auVar108._24_4_;
        auVar44._24_4_ = fVar214 * auVar86._24_4_;
        auVar44._28_4_ = auVar86._28_4_;
        auVar86 = vfmadd213ps_avx512vl(local_5c0,auVar120,auVar112);
        auVar45._4_4_ = fVar235 * auVar86._4_4_;
        auVar45._0_4_ = fVar142 * auVar86._0_4_;
        auVar45._8_4_ = fVar236 * auVar86._8_4_;
        auVar45._12_4_ = fVar237 * auVar86._12_4_;
        auVar45._16_4_ = fVar213 * auVar86._16_4_;
        auVar45._20_4_ = fVar205 * auVar86._20_4_;
        auVar45._24_4_ = fVar214 * auVar86._24_4_;
        auVar45._28_4_ = auVar86._28_4_;
        auVar86 = vminps_avx512vl(auVar44,auVar100);
        auVar52 = ZEXT812(0);
        auVar104 = ZEXT1232(auVar52) << 0x20;
        auVar86 = vmaxps_avx(auVar86,ZEXT1232(auVar52) << 0x20);
        auVar105 = vminps_avx512vl(auVar45,auVar100);
        auVar46._4_4_ = (auVar86._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar86._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar86._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar86._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar86._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar86._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar86._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar86._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar46,local_720,local_780);
        auVar86 = vmaxps_avx(auVar105,ZEXT1232(auVar52) << 0x20);
        auVar47._4_4_ = (auVar86._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar86._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar86._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar86._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar86._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar86._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar86._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar86._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar47,local_720,local_780);
        auVar48._4_4_ = auVar84._4_4_ * auVar84._4_4_;
        auVar48._0_4_ = auVar84._0_4_ * auVar84._0_4_;
        auVar48._8_4_ = auVar84._8_4_ * auVar84._8_4_;
        auVar48._12_4_ = auVar84._12_4_ * auVar84._12_4_;
        auVar48._16_4_ = auVar84._16_4_ * auVar84._16_4_;
        auVar48._20_4_ = auVar84._20_4_ * auVar84._20_4_;
        auVar48._24_4_ = auVar84._24_4_ * auVar84._24_4_;
        auVar48._28_4_ = auVar84._28_4_;
        auVar86 = vsubps_avx(local_740,auVar48);
        auVar49._4_4_ = auVar86._4_4_ * (float)local_7c0._4_4_;
        auVar49._0_4_ = auVar86._0_4_ * (float)local_7c0._0_4_;
        auVar49._8_4_ = auVar86._8_4_ * fStack_7b8;
        auVar49._12_4_ = auVar86._12_4_ * fStack_7b4;
        auVar49._16_4_ = auVar86._16_4_ * fStack_7b0;
        auVar49._20_4_ = auVar86._20_4_ * fStack_7ac;
        auVar49._24_4_ = auVar86._24_4_ * fStack_7a8;
        auVar49._28_4_ = auVar84._28_4_;
        auVar84 = vsubps_avx(local_7a0,auVar49);
        uVar13 = vcmpps_avx512vl(auVar84,ZEXT1232(auVar52) << 0x20,5);
        bVar69 = (byte)uVar13;
        auVar254 = ZEXT3264(local_840);
        if (bVar69 == 0) {
          bVar69 = 0;
          auVar85 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar232 = ZEXT864(0) << 0x20;
          auVar84 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar241 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar131._8_4_ = 0xff800000;
          auVar131._0_8_ = 0xff800000ff800000;
          auVar131._12_4_ = 0xff800000;
          auVar131._16_4_ = 0xff800000;
          auVar131._20_4_ = 0xff800000;
          auVar131._24_4_ = 0xff800000;
          auVar131._28_4_ = 0xff800000;
        }
        else {
          auVar77 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
          uVar72 = vcmpps_avx512vl(auVar84,auVar111,5);
          auVar84 = vsqrtps_avx(auVar84);
          auVar100 = vfnmadd213ps_avx512vl(auVar119,local_7e0,auVar100);
          auVar104 = vfmadd132ps_avx512vl(auVar100,local_7e0,local_7e0);
          auVar100 = vsubps_avx(_local_5a0,auVar84);
          auVar106 = vmulps_avx512vl(auVar100,auVar104);
          auVar84 = vsubps_avx512vl(auVar84,auVar121);
          auVar107 = vmulps_avx512vl(auVar84,auVar104);
          auVar84 = vfmadd213ps_avx512vl(auVar120,auVar106,auVar112);
          auVar50._4_4_ = fVar235 * auVar84._4_4_;
          auVar50._0_4_ = fVar142 * auVar84._0_4_;
          auVar50._8_4_ = fVar236 * auVar84._8_4_;
          auVar50._12_4_ = fVar237 * auVar84._12_4_;
          auVar50._16_4_ = fVar213 * auVar84._16_4_;
          auVar50._20_4_ = fVar205 * auVar84._20_4_;
          auVar50._24_4_ = fVar214 * auVar84._24_4_;
          auVar50._28_4_ = auVar105._28_4_;
          auVar84 = vmulps_avx512vl(local_460,auVar106);
          auVar100 = vmulps_avx512vl(local_380,auVar106);
          auVar104 = vmulps_avx512vl(local_480,auVar106);
          auVar105 = vfmadd213ps_avx512vl(auVar85,auVar50,auVar101);
          auVar84 = vsubps_avx512vl(auVar84,auVar105);
          auVar105 = vfmadd213ps_avx512vl(auVar98,auVar50,auVar102);
          auVar100 = vsubps_avx512vl(auVar100,auVar105);
          auVar76 = vfmadd213ps_fma(auVar50,auVar99,auVar103);
          auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar76));
          auVar241 = auVar104._0_28_;
          auVar104 = vfmadd213ps_avx512vl(auVar120,auVar107,auVar112);
          auVar105 = vmulps_avx512vl(auVar108,auVar104);
          auVar104 = vmulps_avx512vl(local_460,auVar107);
          auVar108 = vmulps_avx512vl(local_380,auVar107);
          auVar109 = vmulps_avx512vl(local_480,auVar107);
          auVar76 = vfmadd213ps_fma(auVar85,auVar105,auVar101);
          auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar98,auVar105,auVar102);
          auVar85 = vsubps_avx512vl(auVar108,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar99,auVar105,auVar103);
          auVar98 = vsubps_avx512vl(auVar109,ZEXT1632(auVar76));
          auVar232 = ZEXT3264(auVar98);
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar98 = vblendmps_avx512vl(auVar150,auVar106);
          bVar71 = (bool)((byte)uVar72 & 1);
          auVar130._0_4_ = (uint)bVar71 * auVar98._0_4_ | (uint)!bVar71 * auVar101._0_4_;
          bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar71 * auVar98._4_4_ | (uint)!bVar71 * auVar101._4_4_;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar71 * auVar98._8_4_ | (uint)!bVar71 * auVar101._8_4_;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar71 * auVar98._12_4_ | (uint)!bVar71 * auVar101._12_4_;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar71 * auVar98._16_4_ | (uint)!bVar71 * auVar101._16_4_;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar71 * auVar98._20_4_ | (uint)!bVar71 * auVar101._20_4_;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar71 * auVar98._24_4_ | (uint)!bVar71 * auVar101._24_4_;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar130._28_4_ = (uint)bVar71 * auVar98._28_4_ | (uint)!bVar71 * auVar101._28_4_;
          auVar151._8_4_ = 0xff800000;
          auVar151._0_8_ = 0xff800000ff800000;
          auVar151._12_4_ = 0xff800000;
          auVar151._16_4_ = 0xff800000;
          auVar151._20_4_ = 0xff800000;
          auVar151._24_4_ = 0xff800000;
          auVar151._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar151,auVar107);
          bVar71 = (bool)((byte)uVar72 & 1);
          auVar131._0_4_ = (uint)bVar71 * auVar98._0_4_ | (uint)!bVar71 * -0x800000;
          bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar71 * auVar98._4_4_ | (uint)!bVar71 * -0x800000;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar71 * auVar98._8_4_ | (uint)!bVar71 * -0x800000;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar71 * auVar98._12_4_ | (uint)!bVar71 * -0x800000;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar71 * auVar98._16_4_ | (uint)!bVar71 * -0x800000;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar71 * auVar98._20_4_ | (uint)!bVar71 * -0x800000;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar71 * auVar98._24_4_ | (uint)!bVar71 * -0x800000;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar131._28_4_ = (uint)bVar71 * auVar98._28_4_ | (uint)!bVar71 * -0x800000;
          auVar25._8_4_ = 0x36000000;
          auVar25._0_8_ = 0x3600000036000000;
          auVar25._12_4_ = 0x36000000;
          auVar25._16_4_ = 0x36000000;
          auVar25._20_4_ = 0x36000000;
          auVar25._24_4_ = 0x36000000;
          auVar25._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(local_5e0,auVar25);
          uVar67 = vcmpps_avx512vl(auVar98,local_600,0xe);
          uVar72 = uVar72 & uVar67;
          bVar68 = (byte)uVar72;
          if (bVar68 != 0) {
            uVar67 = vcmpps_avx512vl(auVar86,ZEXT1632(auVar77),2);
            auVar233._8_4_ = 0x7f800000;
            auVar233._0_8_ = 0x7f8000007f800000;
            auVar233._12_4_ = 0x7f800000;
            auVar233._16_4_ = 0x7f800000;
            auVar233._20_4_ = 0x7f800000;
            auVar233._24_4_ = 0x7f800000;
            auVar233._28_4_ = 0x7f800000;
            auVar247._8_4_ = 0xff800000;
            auVar247._0_8_ = 0xff800000ff800000;
            auVar247._12_4_ = 0xff800000;
            auVar247._16_4_ = 0xff800000;
            auVar247._20_4_ = 0xff800000;
            auVar247._24_4_ = 0xff800000;
            auVar247._28_4_ = 0xff800000;
            auVar86 = vblendmps_avx512vl(auVar233,auVar247);
            bVar65 = (byte)uVar67;
            uVar73 = (uint)(bVar65 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar98._0_4_;
            bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
            uVar135 = (uint)bVar71 * auVar86._4_4_ | (uint)!bVar71 * auVar98._4_4_;
            bVar71 = (bool)((byte)(uVar67 >> 2) & 1);
            uVar136 = (uint)bVar71 * auVar86._8_4_ | (uint)!bVar71 * auVar98._8_4_;
            bVar71 = (bool)((byte)(uVar67 >> 3) & 1);
            uVar137 = (uint)bVar71 * auVar86._12_4_ | (uint)!bVar71 * auVar98._12_4_;
            bVar71 = (bool)((byte)(uVar67 >> 4) & 1);
            uVar138 = (uint)bVar71 * auVar86._16_4_ | (uint)!bVar71 * auVar98._16_4_;
            bVar71 = (bool)((byte)(uVar67 >> 5) & 1);
            uVar139 = (uint)bVar71 * auVar86._20_4_ | (uint)!bVar71 * auVar98._20_4_;
            bVar71 = (bool)((byte)(uVar67 >> 6) & 1);
            uVar140 = (uint)bVar71 * auVar86._24_4_ | (uint)!bVar71 * auVar98._24_4_;
            bVar71 = SUB81(uVar67 >> 7,0);
            uVar141 = (uint)bVar71 * auVar86._28_4_ | (uint)!bVar71 * auVar98._28_4_;
            auVar130._0_4_ = (bVar68 & 1) * uVar73 | !(bool)(bVar68 & 1) * auVar130._0_4_;
            bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar130._4_4_ = bVar71 * uVar135 | !bVar71 * auVar130._4_4_;
            bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar130._8_4_ = bVar71 * uVar136 | !bVar71 * auVar130._8_4_;
            bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar130._12_4_ = bVar71 * uVar137 | !bVar71 * auVar130._12_4_;
            bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar130._16_4_ = bVar71 * uVar138 | !bVar71 * auVar130._16_4_;
            bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar130._20_4_ = bVar71 * uVar139 | !bVar71 * auVar130._20_4_;
            bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar130._24_4_ = bVar71 * uVar140 | !bVar71 * auVar130._24_4_;
            bVar71 = SUB81(uVar72 >> 7,0);
            auVar130._28_4_ = bVar71 * uVar141 | !bVar71 * auVar130._28_4_;
            auVar86 = vblendmps_avx512vl(auVar247,auVar233);
            bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar67 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar67 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar67 >> 6) & 1);
            bVar11 = SUB81(uVar67 >> 7,0);
            auVar131._0_4_ =
                 (uint)(bVar68 & 1) *
                 ((uint)(bVar65 & 1) * auVar86._0_4_ | !(bool)(bVar65 & 1) * uVar73) |
                 !(bool)(bVar68 & 1) * auVar131._0_4_;
            bVar5 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar131._4_4_ =
                 (uint)bVar5 * ((uint)bVar71 * auVar86._4_4_ | !bVar71 * uVar135) |
                 !bVar5 * auVar131._4_4_;
            bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar131._8_4_ =
                 (uint)bVar71 * ((uint)bVar6 * auVar86._8_4_ | !bVar6 * uVar136) |
                 !bVar71 * auVar131._8_4_;
            bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar131._12_4_ =
                 (uint)bVar71 * ((uint)bVar7 * auVar86._12_4_ | !bVar7 * uVar137) |
                 !bVar71 * auVar131._12_4_;
            bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar131._16_4_ =
                 (uint)bVar71 * ((uint)bVar8 * auVar86._16_4_ | !bVar8 * uVar138) |
                 !bVar71 * auVar131._16_4_;
            bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar131._20_4_ =
                 (uint)bVar71 * ((uint)bVar9 * auVar86._20_4_ | !bVar9 * uVar139) |
                 !bVar71 * auVar131._20_4_;
            bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar131._24_4_ =
                 (uint)bVar71 * ((uint)bVar10 * auVar86._24_4_ | !bVar10 * uVar140) |
                 !bVar71 * auVar131._24_4_;
            bVar71 = SUB81(uVar72 >> 7,0);
            auVar131._28_4_ =
                 (uint)bVar71 * ((uint)bVar11 * auVar86._28_4_ | !bVar11 * uVar141) |
                 !bVar71 * auVar131._28_4_;
            bVar69 = (~bVar68 | bVar65) & bVar69;
          }
        }
        auVar248 = ZEXT3264(local_480);
        auVar234._0_4_ = local_480._0_4_ * auVar232._0_4_;
        auVar234._4_4_ = local_480._4_4_ * auVar232._4_4_;
        auVar234._8_4_ = local_480._8_4_ * auVar232._8_4_;
        auVar234._12_4_ = local_480._12_4_ * auVar232._12_4_;
        auVar234._16_4_ = local_480._16_4_ * auVar232._16_4_;
        auVar234._20_4_ = local_480._20_4_ * auVar232._20_4_;
        auVar234._28_36_ = auVar232._28_36_;
        auVar234._24_4_ = local_480._24_4_ * auVar232._24_4_;
        auVar86 = vfmadd231ps_avx512vl(auVar234._0_32_,local_380,auVar85);
        auVar234 = ZEXT3264(local_380);
        auVar86 = vfmadd231ps_avx512vl(auVar86,local_460,auVar104);
        auVar243 = ZEXT3264(local_440);
        _local_200 = local_440;
        local_1e0 = vminps_avx(local_340,auVar130);
        auVar230._8_4_ = 0x7fffffff;
        auVar230._0_8_ = 0x7fffffff7fffffff;
        auVar230._12_4_ = 0x7fffffff;
        auVar230._16_4_ = 0x7fffffff;
        auVar230._20_4_ = 0x7fffffff;
        auVar230._24_4_ = 0x7fffffff;
        auVar230._28_4_ = 0x7fffffff;
        auVar86 = vandps_avx(auVar86,auVar230);
        _local_360 = vmaxps_avx(local_440,auVar131);
        auVar231._8_4_ = 0x3e99999a;
        auVar231._0_8_ = 0x3e99999a3e99999a;
        auVar231._12_4_ = 0x3e99999a;
        auVar231._16_4_ = 0x3e99999a;
        auVar231._20_4_ = 0x3e99999a;
        auVar231._24_4_ = 0x3e99999a;
        auVar231._28_4_ = 0x3e99999a;
        auVar232 = ZEXT3264(auVar231);
        uVar13 = vcmpps_avx512vl(auVar86,auVar231,1);
        uVar15 = vcmpps_avx512vl(local_440,local_1e0,2);
        bVar68 = (byte)uVar15 & bVar64;
        uVar14 = vcmpps_avx512vl(_local_360,local_340,2);
        if ((bVar64 & ((byte)uVar14 | (byte)uVar15)) == 0) {
          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar255 = ZEXT3264(auVar86);
          auVar226 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          _local_400 = _local_360;
          local_850 = (uint)(byte)((byte)uVar13 | ~bVar69);
          auVar51._4_4_ = local_480._4_4_ * auVar241._4_4_;
          auVar51._0_4_ = local_480._0_4_ * auVar241._0_4_;
          auVar51._8_4_ = local_480._8_4_ * auVar241._8_4_;
          auVar51._12_4_ = local_480._12_4_ * auVar241._12_4_;
          auVar51._16_4_ = local_480._16_4_ * auVar241._16_4_;
          auVar51._20_4_ = local_480._20_4_ * auVar241._20_4_;
          auVar51._24_4_ = local_480._24_4_ * auVar241._24_4_;
          auVar51._28_4_ = local_360._28_4_;
          auVar76 = vfmadd213ps_fma(auVar100,local_380,auVar51);
          auVar86 = vfmadd213ps_avx512vl(auVar84,local_460,ZEXT1632(auVar76));
          auVar86 = vandps_avx(auVar86,auVar230);
          uVar13 = vcmpps_avx512vl(auVar86,auVar231,1);
          bVar69 = (byte)uVar13 | ~bVar69;
          auVar152._8_4_ = 2;
          auVar152._0_8_ = 0x200000002;
          auVar152._12_4_ = 2;
          auVar152._16_4_ = 2;
          auVar152._20_4_ = 2;
          auVar152._24_4_ = 2;
          auVar152._28_4_ = 2;
          auVar26._8_4_ = 3;
          auVar26._0_8_ = 0x300000003;
          auVar26._12_4_ = 3;
          auVar26._16_4_ = 3;
          auVar26._20_4_ = 3;
          auVar26._24_4_ = 3;
          auVar26._28_4_ = 3;
          auVar86 = vpblendmd_avx512vl(auVar152,auVar26);
          local_320._0_4_ = (uint)(bVar69 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar69 & 1) * 2;
          bVar71 = (bool)(bVar69 >> 1 & 1);
          local_320._4_4_ = (uint)bVar71 * auVar86._4_4_ | (uint)!bVar71 * 2;
          bVar71 = (bool)(bVar69 >> 2 & 1);
          local_320._8_4_ = (uint)bVar71 * auVar86._8_4_ | (uint)!bVar71 * 2;
          bVar71 = (bool)(bVar69 >> 3 & 1);
          local_320._12_4_ = (uint)bVar71 * auVar86._12_4_ | (uint)!bVar71 * 2;
          bVar71 = (bool)(bVar69 >> 4 & 1);
          local_320._16_4_ = (uint)bVar71 * auVar86._16_4_ | (uint)!bVar71 * 2;
          bVar71 = (bool)(bVar69 >> 5 & 1);
          local_320._20_4_ = (uint)bVar71 * auVar86._20_4_ | (uint)!bVar71 * 2;
          bVar71 = (bool)(bVar69 >> 6 & 1);
          local_320._24_4_ = (uint)bVar71 * auVar86._24_4_ | (uint)!bVar71 * 2;
          local_320._28_4_ = (uint)(bVar69 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar69 >> 7) * 2;
          local_3a0 = vpbroadcastd_avx512vl();
          uVar13 = vpcmpd_avx512vl(local_3a0,local_320,5);
          local_84c = (uint)bVar68;
          local_3e0 = local_440._0_4_ + (float)local_420._0_4_;
          fStack_3dc = local_440._4_4_ + (float)local_420._4_4_;
          fStack_3d8 = local_440._8_4_ + fStack_418;
          fStack_3d4 = local_440._12_4_ + fStack_414;
          fStack_3d0 = local_440._16_4_ + fStack_410;
          fStack_3cc = local_440._20_4_ + fStack_40c;
          fStack_3c8 = local_440._24_4_ + fStack_408;
          fStack_3c4 = local_440._28_4_ + fStack_404;
          for (bVar68 = (byte)uVar13 & bVar68; auVar86 = local_780, bVar68 != 0;
              bVar68 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar68 & (byte)uVar13) {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar84 = vblendmps_avx512vl(auVar153,local_440);
            auVar132._0_4_ =
                 (uint)(bVar68 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar71 * auVar84._4_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar71 * auVar84._8_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar71 * auVar84._12_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar71 * auVar84._16_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar71 * auVar84._20_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 6 & 1);
            auVar132._24_4_ = (uint)bVar71 * auVar84._24_4_ | (uint)!bVar71 * 0x7f800000;
            auVar132._28_4_ =
                 (uint)(bVar68 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar68 >> 7) * 0x7f800000;
            auVar84 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar84 = vminps_avx(auVar132,auVar84);
            auVar85 = vshufpd_avx(auVar84,auVar84,5);
            auVar84 = vminps_avx(auVar84,auVar85);
            auVar85 = vpermpd_avx2(auVar84,0x4e);
            auVar84 = vminps_avx(auVar84,auVar85);
            uVar13 = vcmpps_avx512vl(auVar132,auVar84,0);
            bVar65 = (byte)uVar13 & bVar68;
            bVar69 = bVar68;
            if (bVar65 != 0) {
              bVar69 = bVar65;
            }
            iVar16 = 0;
            for (uVar73 = (uint)bVar69; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            uVar73 = *(uint *)(local_1a0 + (uint)(iVar16 << 2));
            auVar234 = ZEXT464(*(uint *)(local_200 + (uint)(iVar16 << 2)));
            fVar142 = local_848;
            if ((float)local_700._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar16 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar68;
              local_780._2_30_ = auVar86._2_30_;
              auVar232 = ZEXT1664(auVar232._0_16_);
              auVar238 = ZEXT1664(auVar238._0_16_);
              auVar243 = ZEXT1664(auVar243._0_16_);
              auVar248 = ZEXT1664(auVar248._0_16_);
              fVar142 = sqrtf((float)local_700._0_4_);
              bVar68 = local_780[0];
              auVar234 = ZEXT1664(local_7a0._0_16_);
              auVar254 = ZEXT3264(local_840);
            }
            auVar226 = ZEXT464(uVar73);
            auVar77 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar76 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar78 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar79 = vminps_avx(auVar77,auVar78);
            auVar77 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar78 = vmaxps_avx(auVar76,auVar77);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx(auVar79,auVar206);
            auVar77 = vandps_avx(auVar78,auVar206);
            auVar76 = vmaxps_avx(auVar76,auVar77);
            auVar77 = vmovshdup_avx(auVar76);
            auVar77 = vmaxss_avx(auVar77,auVar76);
            auVar76 = vshufpd_avx(auVar76,auVar76,1);
            auVar76 = vmaxss_avx(auVar76,auVar77);
            fVar235 = auVar76._0_4_ * 1.9073486e-06;
            local_640 = vshufps_avx(auVar78,auVar78,0xff);
            lVar70 = 5;
            do {
              do {
                auVar76 = auVar226._0_16_;
                bVar71 = lVar70 == 0;
                lVar70 = lVar70 + -1;
                if (bVar71) goto LAB_019d4b7d;
                local_7a0._0_16_ = auVar234._0_16_;
                uVar166 = auVar234._0_4_;
                auVar144._4_4_ = uVar166;
                auVar144._0_4_ = uVar166;
                auVar144._8_4_ = uVar166;
                auVar144._12_4_ = uVar166;
                auVar77 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_6f0);
                fVar240 = auVar226._0_4_;
                fVar222 = 1.0 - fVar240;
                fVar213 = fVar222 * fVar222 * fVar222;
                fVar236 = fVar240 * fVar240;
                fVar221 = fVar240 * fVar236;
                auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                          ZEXT416((uint)fVar221));
                fVar237 = fVar240 * fVar222;
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar237 * 6.0)),
                                          ZEXT416((uint)(fVar222 * fVar237)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                          ZEXT416((uint)fVar213));
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * fVar237 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar240 * fVar237)));
                fVar213 = fVar213 * 0.16666667;
                fVar205 = (auVar78._0_4_ + auVar74._0_4_) * 0.16666667;
                fVar214 = (auVar79._0_4_ + auVar3._0_4_) * 0.16666667;
                fVar221 = fVar221 * 0.16666667;
                auVar184._0_4_ = fVar221 * (float)local_6e0._0_4_;
                auVar184._4_4_ = fVar221 * (float)local_6e0._4_4_;
                auVar184._8_4_ = fVar221 * fStack_6d8;
                auVar184._12_4_ = fVar221 * fStack_6d4;
                auVar215._4_4_ = fVar214;
                auVar215._0_4_ = fVar214;
                auVar215._8_4_ = fVar214;
                auVar215._12_4_ = fVar214;
                auVar78 = vfmadd132ps_fma(auVar215,auVar184,local_6a0._0_16_);
                auVar185._4_4_ = fVar205;
                auVar185._0_4_ = fVar205;
                auVar185._8_4_ = fVar205;
                auVar185._12_4_ = fVar205;
                auVar78 = vfmadd132ps_fma(auVar185,auVar78,local_6c0._0_16_);
                auVar167._4_4_ = fVar213;
                auVar167._0_4_ = fVar213;
                auVar167._8_4_ = fVar213;
                auVar167._12_4_ = fVar213;
                auVar78 = vfmadd132ps_fma(auVar167,auVar78,local_680._0_16_);
                local_580._0_16_ = auVar78;
                auVar78 = vsubps_avx(auVar77,auVar78);
                auVar77 = vdpps_avx(auVar78,auVar78,0x7f);
                local_720._0_16_ = auVar78;
                local_740._0_16_ = auVar77;
                local_780._0_16_ = ZEXT416((uint)fVar222);
                if (auVar77._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar236;
                  local_7e0._0_4_ = fVar237;
                  auVar232._0_4_ = sqrtf(auVar77._0_4_);
                  auVar232._4_60_ = extraout_var;
                  auVar77 = auVar232._0_16_;
                  fVar237 = (float)local_7e0._0_4_;
                  auVar78 = local_780._0_16_;
                }
                else {
                  auVar77 = vsqrtss_avx(auVar77,auVar77);
                  local_7c0._0_4_ = fVar236;
                  auVar78 = ZEXT416((uint)fVar222);
                }
                local_5a0._4_4_ = auVar78._0_4_;
                local_5a0._0_4_ = local_5a0._4_4_;
                fStack_598 = (float)local_5a0._4_4_;
                fStack_594 = (float)local_5a0._4_4_;
                auVar79 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar237 * 4.0)));
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * 4.0)),auVar78,auVar78);
                fVar236 = (float)local_5a0._4_4_ * -(float)local_5a0._4_4_ * 0.5;
                fVar237 = auVar79._0_4_ * 0.5;
                fVar213 = auVar78._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar207._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar207._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar207._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar207._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar168._4_4_ = fVar213;
                auVar168._0_4_ = fVar213;
                auVar168._8_4_ = fVar213;
                auVar168._12_4_ = fVar213;
                auVar78 = vfmadd132ps_fma(auVar168,auVar207,local_6a0._0_16_);
                auVar186._4_4_ = fVar237;
                auVar186._0_4_ = fVar237;
                auVar186._8_4_ = fVar237;
                auVar186._12_4_ = fVar237;
                auVar78 = vfmadd132ps_fma(auVar186,auVar78,local_6c0._0_16_);
                auVar245._4_4_ = fVar236;
                auVar245._0_4_ = fVar236;
                auVar245._8_4_ = fVar236;
                auVar245._12_4_ = fVar236;
                _local_7c0 = vfmadd132ps_fma(auVar245,auVar78,local_680._0_16_);
                local_5c0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                fVar236 = local_5c0._0_4_;
                auVar78 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar236));
                fVar237 = auVar78._0_4_;
                local_5e0._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar236));
                auVar78 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
                local_600._0_4_ = auVar78._0_4_;
                local_7e0._0_4_ = auVar77._0_4_;
                if (fVar236 < -fVar236) {
                  auVar238._0_4_ = sqrtf(fVar236);
                  auVar238._4_60_ = extraout_var_00;
                  auVar77 = ZEXT416((uint)local_7e0._0_4_);
                  auVar79 = auVar238._0_16_;
                  auVar78 = _local_7c0;
                }
                else {
                  auVar79 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                  auVar78 = _local_7c0;
                }
                fVar236 = fVar237 * 1.5 + fVar236 * -0.5 * fVar237 * fVar237 * fVar237;
                auVar223._0_4_ = auVar78._0_4_ * fVar236;
                auVar223._4_4_ = auVar78._4_4_ * fVar236;
                auVar223._8_4_ = auVar78._8_4_ * fVar236;
                auVar223._12_4_ = auVar78._12_4_ * fVar236;
                auVar74 = vdpps_avx(local_720._0_16_,auVar223,0x7f);
                fVar205 = auVar77._0_4_;
                fVar237 = auVar74._0_4_;
                auVar145._0_4_ = fVar237 * fVar237;
                auVar145._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                auVar145._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                auVar145._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                auVar3 = vsubps_avx(local_740._0_16_,auVar145);
                fVar213 = auVar3._0_4_;
                auVar169._4_12_ = ZEXT812(0) << 0x20;
                auVar169._0_4_ = fVar213;
                auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
                auVar75 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
                auVar81 = vmulss_avx512f(auVar3,ZEXT416(0xbf000000));
                if (fVar213 < 0.0) {
                  local_630 = fVar236;
                  fStack_62c = fVar236;
                  fStack_628 = fVar236;
                  fStack_624 = fVar236;
                  local_620 = auVar223;
                  local_610 = auVar80;
                  fVar213 = sqrtf(fVar213);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar75 = ZEXT416(auVar75._0_4_);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar77 = ZEXT416((uint)local_7e0._0_4_);
                  auVar223 = local_620;
                  auVar78 = _local_7c0;
                  auVar80 = local_610;
                  fVar236 = local_630;
                  fVar214 = fStack_62c;
                  fVar221 = fStack_628;
                  fVar222 = fStack_624;
                }
                else {
                  auVar3 = vsqrtss_avx(auVar3,auVar3);
                  fVar213 = auVar3._0_4_;
                  fVar214 = fVar236;
                  fVar221 = fVar236;
                  fVar222 = fVar236;
                }
                auVar248 = ZEXT1664(auVar78);
                auVar243 = ZEXT1664(local_740._0_16_);
                auVar238 = ZEXT1664(local_720._0_16_);
                auVar254 = ZEXT3264(local_840);
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,auVar76);
                auVar76 = vfmadd231ss_fma(local_780._0_16_,auVar76,SUB6416(ZEXT464(0xc0000000),0));
                auVar187._0_4_ = fVar240 * (float)local_6e0._0_4_;
                auVar187._4_4_ = fVar240 * (float)local_6e0._4_4_;
                auVar187._8_4_ = fVar240 * fStack_6d8;
                auVar187._12_4_ = fVar240 * fStack_6d4;
                auVar208._0_4_ = auVar76._0_4_;
                auVar208._4_4_ = auVar208._0_4_;
                auVar208._8_4_ = auVar208._0_4_;
                auVar208._12_4_ = auVar208._0_4_;
                auVar76 = vfmadd132ps_fma(auVar208,auVar187,local_6a0._0_16_);
                auVar170._0_4_ = auVar3._0_4_;
                auVar170._4_4_ = auVar170._0_4_;
                auVar170._8_4_ = auVar170._0_4_;
                auVar170._12_4_ = auVar170._0_4_;
                auVar76 = vfmadd132ps_fma(auVar170,auVar76,local_6c0._0_16_);
                auVar76 = vfmadd132ps_fma(_local_5a0,auVar76,local_680._0_16_);
                auVar171._0_4_ = auVar76._0_4_ * (float)local_5c0._0_4_;
                auVar171._4_4_ = auVar76._4_4_ * (float)local_5c0._0_4_;
                auVar171._8_4_ = auVar76._8_4_ * (float)local_5c0._0_4_;
                auVar171._12_4_ = auVar76._12_4_ * (float)local_5c0._0_4_;
                auVar76 = vdpps_avx(auVar78,auVar76,0x7f);
                fVar183 = auVar76._0_4_;
                auVar188._0_4_ = auVar78._0_4_ * fVar183;
                auVar188._4_4_ = auVar78._4_4_ * fVar183;
                auVar188._8_4_ = auVar78._8_4_ * fVar183;
                auVar188._12_4_ = auVar78._12_4_ * fVar183;
                auVar76 = vsubps_avx(auVar171,auVar188);
                fVar183 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar82 = vxorps_avx512vl(auVar78,auVar18);
                auVar216._0_4_ = fVar236 * auVar76._0_4_ * fVar183;
                auVar216._4_4_ = fVar214 * auVar76._4_4_ * fVar183;
                auVar216._8_4_ = fVar221 * auVar76._8_4_ * fVar183;
                auVar216._12_4_ = fVar222 * auVar76._12_4_ * fVar183;
                auVar76 = vdpps_avx(auVar82,auVar223,0x7f);
                auVar3 = vmaxss_avx(ZEXT416((uint)fVar235),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * fVar142 * 1.9073486e-06)
                                           ));
                auVar83 = vdivss_avx512f(ZEXT416((uint)fVar235),auVar79);
                auVar79 = vdpps_avx(local_720._0_16_,auVar216,0x7f);
                auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar235),auVar3);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar205 + 1.0)),auVar83,auVar77);
                auVar77 = vdpps_avx(local_6f0,auVar223,0x7f);
                fVar236 = auVar76._0_4_ + auVar79._0_4_;
                auVar76 = vdpps_avx(local_720._0_16_,auVar82,0x7f);
                auVar81 = vmulss_avx512f(auVar81,auVar80);
                auVar80 = vmulss_avx512f(auVar80,auVar80);
                auVar79 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar81 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar81._0_4_ * auVar80._0_4_)));
                auVar80 = vfnmadd231ss_fma(auVar76,auVar74,ZEXT416((uint)fVar236));
                auVar75 = vfnmadd231ss_fma(auVar79,auVar74,auVar77);
                auVar76 = vpermilps_avx(local_580._0_16_,0xff);
                fVar213 = fVar213 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar78,auVar78,0xff);
                auVar79 = vfmsub213ss_fma(auVar80,auVar81,auVar76);
                fVar205 = auVar75._0_4_ * auVar81._0_4_;
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar79._0_4_)),
                                          ZEXT416((uint)fVar236),ZEXT416((uint)fVar205));
                auVar232 = ZEXT1664(auVar80);
                fVar214 = auVar80._0_4_;
                fVar240 = fVar240 - (fVar237 * (fVar205 / fVar214) -
                                    fVar213 * (auVar77._0_4_ / fVar214));
                auVar226 = ZEXT464((uint)fVar240);
                fVar236 = (float)local_7a0._0_4_ -
                          (fVar213 * (fVar236 / fVar214) - fVar237 * (auVar79._0_4_ / fVar214));
                auVar234 = ZEXT464((uint)fVar236);
                auVar19._8_4_ = 0x7fffffff;
                auVar19._0_8_ = 0x7fffffff7fffffff;
                auVar19._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(auVar74,auVar19);
              } while (auVar83._0_4_ <= auVar77._0_4_);
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar3._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(ZEXT416((uint)fVar213),auVar20);
            } while (auVar77._0_4_ <= auVar79._0_4_);
            fVar142 = fVar236 + (float)local_650._0_4_;
            if ((((fVar158 <= fVar142) &&
                 (fVar235 = pre->ray_space[2].vy.field_0.m128[(long)ray], fVar142 <= fVar235)) &&
                (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
              auVar189._4_12_ = SUB1612(ZEXT816(0),0);
              auVar189._0_4_ = local_740._0_4_;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar189);
              fVar237 = auVar77._0_4_;
              lVar70 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar160 * 8);
              if ((*(uint *)(lVar70 + 0x34) & (uint)pre->ray_space[2].vz.field_0.m128[(long)ray]) !=
                  0) {
                fVar237 = fVar237 * 1.5 + local_740._0_4_ * -0.5 * fVar237 * fVar237 * fVar237;
                auVar190._0_4_ = local_720._0_4_ * fVar237;
                auVar190._4_4_ = local_720._4_4_ * fVar237;
                auVar190._8_4_ = local_720._8_4_ * fVar237;
                auVar190._12_4_ = local_720._12_4_ * fVar237;
                auVar74 = vfmadd213ps_fma(auVar76,auVar190,auVar78);
                auVar76 = vshufps_avx(auVar190,auVar190,0xc9);
                auVar77 = vshufps_avx(auVar78,auVar78,0xc9);
                auVar191._0_4_ = auVar190._0_4_ * auVar77._0_4_;
                auVar191._4_4_ = auVar190._4_4_ * auVar77._4_4_;
                auVar191._8_4_ = auVar190._8_4_ * auVar77._8_4_;
                auVar191._12_4_ = auVar190._12_4_ * auVar77._12_4_;
                auVar79 = vfmsub231ps_fma(auVar191,auVar78,auVar76);
                auVar76 = vshufps_avx(auVar79,auVar79,0xc9);
                auVar77 = vshufps_avx(auVar74,auVar74,0xc9);
                auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                auVar146._0_4_ = auVar74._0_4_ * auVar79._0_4_;
                auVar146._4_4_ = auVar74._4_4_ * auVar79._4_4_;
                auVar146._8_4_ = auVar74._8_4_ * auVar79._8_4_;
                auVar146._12_4_ = auVar74._12_4_ * auVar79._12_4_;
                auVar76 = vfmsub231ps_fma(auVar146,auVar76,auVar77);
                fVar237 = auVar76._0_4_;
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar70 + 0x40) == 0))
                {
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar142;
                  fVar142 = (float)vextractps_avx(auVar76,1);
                  pre->ray_space[3].vz.field_0.m128[(long)ray] = fVar142;
                  uVar166 = vextractps_avx(auVar76,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x10) = uVar166;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar237;
                  pre[1].ray_space[0].vy.field_0.m128[(long)ray] = fVar240;
                  pre[1].ray_space[0].vz.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[1].vx.field_0.m128[(long)ray] = fVar252;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar160;
                  pre[1].ray_space[1].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[2].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  local_520._0_16_ = vshufps_avx(auVar76,auVar76,0x55);
                  local_520._16_16_ = vshufps_avx(auVar76,auVar76,0xaa);
                  local_500 = fVar237;
                  fStack_4fc = fVar237;
                  fStack_4f8 = fVar237;
                  fStack_4f4 = fVar237;
                  local_4f0 = fVar240;
                  fStack_4ec = fVar240;
                  fStack_4e8 = fVar240;
                  fStack_4e4 = fVar240;
                  local_4e0 = ZEXT416(0) << 0x20;
                  local_4d0 = local_540._0_8_;
                  uStack_4c8 = local_540._8_8_;
                  local_4c0 = local_530;
                  vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                  uStack_4ac = **(undefined4 **)(k + 8);
                  local_4b0 = uStack_4ac;
                  uStack_4a8 = uStack_4ac;
                  uStack_4a4 = uStack_4ac;
                  uStack_4a0 = (*(undefined4 **)(k + 8))[1];
                  uStack_49c = uStack_4a0;
                  uStack_498 = uStack_4a0;
                  uStack_494 = uStack_4a0;
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar142;
                  local_870 = local_550;
                  local_810 = local_870;
                  local_808 = *(undefined8 *)(lVar70 + 0x18);
                  local_800 = *(undefined8 *)(k + 8);
                  local_7f0 = (int *)local_520;
                  local_7e8 = 4;
                  local_7f8 = pre;
                  if (*(code **)(lVar70 + 0x40) != (code *)0x0) {
                    auVar232 = ZEXT1664(auVar80);
                    auVar234 = ZEXT464((uint)fVar236);
                    auVar238 = ZEXT1664(local_720._0_16_);
                    auVar243 = ZEXT1664(local_740._0_16_);
                    auVar248 = ZEXT1664(auVar78);
                    (**(code **)(lVar70 + 0x40))(&local_810);
                    auVar254 = ZEXT3264(local_840);
                  }
                  uVar72 = vptestmd_avx512vl(local_870,local_870);
                  if ((uVar72 & 0xf) != 0) {
                    pcVar4 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar4 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar70 + 0x3e) & 0x40) != 0)))) {
                      auVar232 = ZEXT1664(auVar232._0_16_);
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      auVar248 = ZEXT1664(auVar248._0_16_);
                      (*pcVar4)(&local_810);
                      auVar254 = ZEXT3264(local_840);
                    }
                    uVar72 = vptestmd_avx512vl(local_870,local_870);
                    uVar72 = uVar72 & 0xf;
                    bVar69 = (byte)uVar72;
                    if (bVar69 != 0) {
                      iVar55 = local_7f0[1];
                      iVar56 = local_7f0[2];
                      iVar57 = local_7f0[3];
                      pVVar1 = &local_7f8->ray_space[3].vz;
                      iVar58 = *(int *)((long)&local_7f8->ray_space[3].vz.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8->ray_space[3].vz.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8->ray_space[3].vz.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      (pVVar1->field_0).m128[0] =
                           (float)((uint)(bVar69 & 1) * *local_7f0 |
                                  (uint)!(bool)(bVar69 & 1) * *(int *)&pVVar1->field_0);
                      local_7f8->ray_space[3].vz.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8->ray_space[3].vz.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8->ray_space[3].vz.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      iVar55 = local_7f0[5];
                      iVar56 = local_7f0[6];
                      iVar57 = local_7f0[7];
                      iVar58 = local_7f8[1].depth_scale.field_0.i[1];
                      iVar59 = local_7f8[1].depth_scale.field_0.i[2];
                      iVar60 = local_7f8[1].depth_scale.field_0.i[3];
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      local_7f8[1].depth_scale.field_0.i[0] =
                           (uint)(bVar69 & 1) * local_7f0[4] |
                           (uint)!(bool)(bVar69 & 1) * local_7f8[1].depth_scale.field_0.i[0];
                      local_7f8[1].depth_scale.field_0.i[1] =
                           (uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58;
                      local_7f8[1].depth_scale.field_0.i[2] =
                           (uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59;
                      local_7f8[1].depth_scale.field_0.i[3] =
                           (uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60;
                      iVar55 = local_7f0[9];
                      iVar56 = local_7f0[10];
                      iVar57 = local_7f0[0xb];
                      iVar58 = *(int *)((long)&local_7f8[1].ray_space[0].vx.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8[1].ray_space[0].vx.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8[1].ray_space[0].vx.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      local_7f8[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar69 & 1) * local_7f0[8] |
                                  (uint)!(bool)(bVar69 & 1) *
                                  *(int *)&local_7f8[1].ray_space[0].vx.field_0);
                      local_7f8[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      iVar55 = local_7f0[0xd];
                      iVar56 = local_7f0[0xe];
                      iVar57 = local_7f0[0xf];
                      pVVar1 = &local_7f8[1].ray_space[0].vy;
                      iVar58 = *(int *)((long)&local_7f8[1].ray_space[0].vy.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8[1].ray_space[0].vy.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8[1].ray_space[0].vy.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      (pVVar1->field_0).m128[0] =
                           (float)((uint)(bVar69 & 1) * local_7f0[0xc] |
                                  (uint)!(bool)(bVar69 & 1) * *(int *)&pVVar1->field_0);
                      local_7f8[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      iVar55 = local_7f0[0x11];
                      iVar56 = local_7f0[0x12];
                      iVar57 = local_7f0[0x13];
                      pVVar1 = &local_7f8[1].ray_space[0].vz;
                      iVar58 = *(int *)((long)&local_7f8[1].ray_space[0].vz.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8[1].ray_space[0].vz.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8[1].ray_space[0].vz.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      (pVVar1->field_0).m128[0] =
                           (float)((uint)(bVar69 & 1) * local_7f0[0x10] |
                                  (uint)!(bool)(bVar69 & 1) * *(int *)&pVVar1->field_0);
                      local_7f8[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x14));
                      local_7f8[1].ray_space[1].vx.field_0 = aVar2;
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x18));
                      local_7f8[1].ray_space[1].vy.field_0 = aVar2;
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x1c));
                      local_7f8[1].ray_space[1].vz.field_0 = aVar2;
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x20));
                      local_7f8[1].ray_space[2].vx.field_0 = aVar2;
                      goto LAB_019d4b7d;
                    }
                  }
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar235;
                }
              }
            }
LAB_019d4b7d:
            uVar166 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
            auVar224._4_4_ = uVar166;
            auVar224._0_4_ = uVar166;
            auVar224._8_4_ = uVar166;
            auVar224._12_4_ = uVar166;
            auVar224._16_4_ = uVar166;
            auVar224._20_4_ = uVar166;
            auVar224._24_4_ = uVar166;
            auVar224._28_4_ = uVar166;
            auVar226 = ZEXT3264(auVar224);
            auVar61._4_4_ = fStack_3dc;
            auVar61._0_4_ = local_3e0;
            auVar61._8_4_ = fStack_3d8;
            auVar61._12_4_ = fStack_3d4;
            auVar61._16_4_ = fStack_3d0;
            auVar61._20_4_ = fStack_3cc;
            auVar61._24_4_ = fStack_3c8;
            auVar61._28_4_ = fStack_3c4;
            uVar13 = vcmpps_avx512vl(auVar224,auVar61,0xd);
          }
          auVar154._0_4_ = (float)local_420._0_4_ + (float)local_400._0_4_;
          auVar154._4_4_ = (float)local_420._4_4_ + (float)local_400._4_4_;
          auVar154._8_4_ = fStack_418 + fStack_3f8;
          auVar154._12_4_ = fStack_414 + fStack_3f4;
          auVar154._16_4_ = fStack_410 + fStack_3f0;
          auVar154._20_4_ = fStack_40c + fStack_3ec;
          auVar154._24_4_ = fStack_408 + fStack_3e8;
          auVar154._28_4_ = fStack_404 + fStack_3e4;
          uVar166 = auVar226._0_4_;
          auVar178._4_4_ = uVar166;
          auVar178._0_4_ = uVar166;
          auVar178._8_4_ = uVar166;
          auVar178._12_4_ = uVar166;
          auVar178._16_4_ = uVar166;
          auVar178._20_4_ = uVar166;
          auVar178._24_4_ = uVar166;
          auVar178._28_4_ = uVar166;
          uVar13 = vcmpps_avx512vl(auVar154,auVar178,2);
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar27._8_4_ = 3;
          auVar27._0_8_ = 0x300000003;
          auVar27._12_4_ = 3;
          auVar27._16_4_ = 3;
          auVar27._20_4_ = 3;
          auVar27._24_4_ = 3;
          auVar27._28_4_ = 3;
          auVar86 = vpblendmd_avx512vl(auVar155,auVar27);
          bVar71 = (bool)((byte)local_850 & 1);
          local_400._0_4_ = (uint)bVar71 * auVar86._0_4_ | (uint)!bVar71 * 2;
          bVar71 = (bool)((byte)(local_850 >> 1) & 1);
          local_400._4_4_ = (uint)bVar71 * auVar86._4_4_ | (uint)!bVar71 * 2;
          bVar71 = (bool)((byte)(local_850 >> 2) & 1);
          fStack_3f8 = (float)((uint)bVar71 * auVar86._8_4_ | (uint)!bVar71 * 2);
          bVar71 = (bool)((byte)(local_850 >> 3) & 1);
          fStack_3f4 = (float)((uint)bVar71 * auVar86._12_4_ | (uint)!bVar71 * 2);
          bVar71 = (bool)((byte)(local_850 >> 4) & 1);
          fStack_3f0 = (float)((uint)bVar71 * auVar86._16_4_ | (uint)!bVar71 * 2);
          bVar71 = (bool)((byte)(local_850 >> 5) & 1);
          fStack_3ec = (float)((uint)bVar71 * auVar86._20_4_ | (uint)!bVar71 * 2);
          bVar71 = (bool)((byte)(local_850 >> 6) & 1);
          fStack_3e8 = (float)((uint)bVar71 * auVar86._24_4_ | (uint)!bVar71 * 2);
          bVar71 = (bool)((byte)(local_850 >> 7) & 1);
          fStack_3e4 = (float)((uint)bVar71 * auVar86._28_4_ | (uint)!bVar71 * 2);
          bVar64 = (byte)uVar14 & bVar64 & (byte)uVar13;
          uVar13 = vpcmpd_avx512vl(_local_400,local_3a0,2);
          local_440 = _local_360;
          local_3e0 = (float)local_420._0_4_ + (float)local_360._0_4_;
          fStack_3dc = (float)local_420._4_4_ + (float)local_360._4_4_;
          fStack_3d8 = fStack_418 + fStack_358;
          fStack_3d4 = fStack_414 + fStack_354;
          fStack_3d0 = fStack_410 + fStack_350;
          fStack_3cc = fStack_40c + fStack_34c;
          fStack_3c8 = fStack_408 + fStack_348;
          fStack_3c4 = fStack_404 + fStack_344;
          for (bVar69 = (byte)uVar13 & bVar64; auVar86 = local_780, bVar69 != 0;
              bVar69 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar69 & (byte)uVar13) {
            auVar156._8_4_ = 0x7f800000;
            auVar156._0_8_ = 0x7f8000007f800000;
            auVar156._12_4_ = 0x7f800000;
            auVar156._16_4_ = 0x7f800000;
            auVar156._20_4_ = 0x7f800000;
            auVar156._24_4_ = 0x7f800000;
            auVar156._28_4_ = 0x7f800000;
            auVar84 = vblendmps_avx512vl(auVar156,local_440);
            auVar133._0_4_ =
                 (uint)(bVar69 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
            bVar71 = (bool)(bVar69 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar71 * auVar84._4_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar69 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar71 * auVar84._8_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar69 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar71 * auVar84._12_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar69 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar71 * auVar84._16_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar69 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar71 * auVar84._20_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar69 >> 6 & 1);
            auVar133._24_4_ = (uint)bVar71 * auVar84._24_4_ | (uint)!bVar71 * 0x7f800000;
            auVar133._28_4_ =
                 (uint)(bVar69 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar69 >> 7) * 0x7f800000;
            auVar84 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar84 = vminps_avx(auVar133,auVar84);
            auVar85 = vshufpd_avx(auVar84,auVar84,5);
            auVar84 = vminps_avx(auVar84,auVar85);
            auVar85 = vpermpd_avx2(auVar84,0x4e);
            auVar84 = vminps_avx(auVar84,auVar85);
            uVar13 = vcmpps_avx512vl(auVar133,auVar84,0);
            bVar65 = (byte)uVar13 & bVar69;
            bVar68 = bVar69;
            if (bVar65 != 0) {
              bVar68 = bVar65;
            }
            iVar16 = 0;
            for (uVar73 = (uint)bVar68; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            uVar73 = *(uint *)(local_1c0 + (uint)(iVar16 << 2));
            auVar234 = ZEXT464(*(uint *)(local_340 + (uint)(iVar16 << 2)));
            fVar142 = local_844;
            if ((float)local_700._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar16 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar69;
              local_780._2_30_ = auVar86._2_30_;
              auVar232 = ZEXT1664(auVar232._0_16_);
              auVar238 = ZEXT1664(auVar238._0_16_);
              auVar243 = ZEXT1664(auVar243._0_16_);
              auVar248 = ZEXT1664(auVar248._0_16_);
              fVar142 = sqrtf((float)local_700._0_4_);
              bVar69 = local_780[0];
              auVar234 = ZEXT1664(local_7a0._0_16_);
              auVar254 = ZEXT3264(local_840);
            }
            auVar226 = ZEXT464(uVar73);
            auVar77 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar76 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar78 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar79 = vminps_avx(auVar77,auVar78);
            auVar77 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar78 = vmaxps_avx(auVar76,auVar77);
            auVar209._8_4_ = 0x7fffffff;
            auVar209._0_8_ = 0x7fffffff7fffffff;
            auVar209._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx(auVar79,auVar209);
            auVar77 = vandps_avx(auVar78,auVar209);
            auVar76 = vmaxps_avx(auVar76,auVar77);
            auVar77 = vmovshdup_avx(auVar76);
            auVar77 = vmaxss_avx(auVar77,auVar76);
            auVar76 = vshufpd_avx(auVar76,auVar76,1);
            auVar76 = vmaxss_avx(auVar76,auVar77);
            fVar235 = auVar76._0_4_ * 1.9073486e-06;
            local_640 = vshufps_avx(auVar78,auVar78,0xff);
            lVar70 = 5;
            do {
              do {
                auVar76 = auVar226._0_16_;
                bVar71 = lVar70 == 0;
                lVar70 = lVar70 + -1;
                if (bVar71) goto LAB_019d5843;
                local_7a0._0_16_ = auVar234._0_16_;
                uVar166 = auVar234._0_4_;
                auVar147._4_4_ = uVar166;
                auVar147._0_4_ = uVar166;
                auVar147._8_4_ = uVar166;
                auVar147._12_4_ = uVar166;
                auVar77 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_6f0);
                fVar240 = auVar226._0_4_;
                fVar222 = 1.0 - fVar240;
                fVar213 = fVar222 * fVar222 * fVar222;
                fVar236 = fVar240 * fVar240;
                fVar221 = fVar240 * fVar236;
                auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                          ZEXT416((uint)fVar221));
                fVar237 = fVar240 * fVar222;
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar237 * 6.0)),
                                          ZEXT416((uint)(fVar222 * fVar237)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                          ZEXT416((uint)fVar213));
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * fVar237 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar240 * fVar237)));
                fVar213 = fVar213 * 0.16666667;
                fVar205 = (auVar78._0_4_ + auVar74._0_4_) * 0.16666667;
                fVar214 = (auVar79._0_4_ + auVar3._0_4_) * 0.16666667;
                fVar221 = fVar221 * 0.16666667;
                auVar192._0_4_ = fVar221 * (float)local_6e0._0_4_;
                auVar192._4_4_ = fVar221 * (float)local_6e0._4_4_;
                auVar192._8_4_ = fVar221 * fStack_6d8;
                auVar192._12_4_ = fVar221 * fStack_6d4;
                auVar217._4_4_ = fVar214;
                auVar217._0_4_ = fVar214;
                auVar217._8_4_ = fVar214;
                auVar217._12_4_ = fVar214;
                auVar78 = vfmadd132ps_fma(auVar217,auVar192,local_6a0._0_16_);
                auVar193._4_4_ = fVar205;
                auVar193._0_4_ = fVar205;
                auVar193._8_4_ = fVar205;
                auVar193._12_4_ = fVar205;
                auVar78 = vfmadd132ps_fma(auVar193,auVar78,local_6c0._0_16_);
                auVar172._4_4_ = fVar213;
                auVar172._0_4_ = fVar213;
                auVar172._8_4_ = fVar213;
                auVar172._12_4_ = fVar213;
                auVar78 = vfmadd132ps_fma(auVar172,auVar78,local_680._0_16_);
                local_580._0_16_ = auVar78;
                auVar78 = vsubps_avx(auVar77,auVar78);
                auVar77 = vdpps_avx(auVar78,auVar78,0x7f);
                local_720._0_16_ = auVar78;
                local_740._0_16_ = auVar77;
                local_780._0_16_ = ZEXT416((uint)fVar222);
                if (auVar77._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar236;
                  local_7e0._0_4_ = fVar237;
                  auVar243._0_4_ = sqrtf(auVar77._0_4_);
                  auVar243._4_60_ = extraout_var_01;
                  auVar77 = auVar243._0_16_;
                  fVar237 = (float)local_7e0._0_4_;
                  auVar78 = local_780._0_16_;
                }
                else {
                  auVar77 = vsqrtss_avx(auVar77,auVar77);
                  local_7c0._0_4_ = fVar236;
                  auVar78 = ZEXT416((uint)fVar222);
                }
                local_5a0._4_4_ = auVar78._0_4_;
                local_5a0._0_4_ = local_5a0._4_4_;
                fStack_598 = (float)local_5a0._4_4_;
                fStack_594 = (float)local_5a0._4_4_;
                auVar79 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar237 * 4.0)));
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * 4.0)),auVar78,auVar78);
                fVar236 = (float)local_5a0._4_4_ * -(float)local_5a0._4_4_ * 0.5;
                fVar237 = auVar79._0_4_ * 0.5;
                fVar213 = auVar78._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar210._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar210._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar210._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar210._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar173._4_4_ = fVar213;
                auVar173._0_4_ = fVar213;
                auVar173._8_4_ = fVar213;
                auVar173._12_4_ = fVar213;
                auVar78 = vfmadd132ps_fma(auVar173,auVar210,local_6a0._0_16_);
                auVar194._4_4_ = fVar237;
                auVar194._0_4_ = fVar237;
                auVar194._8_4_ = fVar237;
                auVar194._12_4_ = fVar237;
                auVar78 = vfmadd132ps_fma(auVar194,auVar78,local_6c0._0_16_);
                auVar246._4_4_ = fVar236;
                auVar246._0_4_ = fVar236;
                auVar246._8_4_ = fVar236;
                auVar246._12_4_ = fVar236;
                _local_7c0 = vfmadd132ps_fma(auVar246,auVar78,local_680._0_16_);
                local_5c0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar54._12_4_ = 0;
                auVar54._0_12_ = ZEXT812(0);
                fVar236 = local_5c0._0_4_;
                auVar78 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar236));
                fVar237 = auVar78._0_4_;
                local_5e0._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar236));
                auVar78 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
                local_600._0_4_ = auVar78._0_4_;
                local_7e0._0_4_ = auVar77._0_4_;
                if (fVar236 < -fVar236) {
                  auVar248._0_4_ = sqrtf(fVar236);
                  auVar248._4_60_ = extraout_var_02;
                  auVar77 = ZEXT416((uint)local_7e0._0_4_);
                  auVar79 = auVar248._0_16_;
                  auVar78 = _local_7c0;
                }
                else {
                  auVar79 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                  auVar78 = _local_7c0;
                }
                fVar236 = fVar237 * 1.5 + fVar236 * -0.5 * fVar237 * fVar237 * fVar237;
                auVar253._0_4_ = auVar78._0_4_ * fVar236;
                auVar253._4_4_ = auVar78._4_4_ * fVar236;
                auVar253._8_4_ = auVar78._8_4_ * fVar236;
                auVar253._12_4_ = auVar78._12_4_ * fVar236;
                auVar74 = vdpps_avx(local_720._0_16_,auVar253,0x7f);
                fVar205 = auVar77._0_4_;
                fVar237 = auVar74._0_4_;
                auVar148._0_4_ = fVar237 * fVar237;
                auVar148._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                auVar148._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                auVar148._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                auVar3 = vsubps_avx(local_740._0_16_,auVar148);
                fVar213 = auVar3._0_4_;
                auVar174._4_12_ = ZEXT812(0) << 0x20;
                auVar174._0_4_ = fVar213;
                auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                auVar75 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
                auVar81 = vmulss_avx512f(auVar3,ZEXT416(0xbf000000));
                if (fVar213 < 0.0) {
                  local_630 = fVar236;
                  fStack_62c = fVar236;
                  fStack_628 = fVar236;
                  fStack_624 = fVar236;
                  local_620 = auVar253;
                  local_610 = auVar80;
                  fVar213 = sqrtf(fVar213);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar75 = ZEXT416(auVar75._0_4_);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar77 = ZEXT416((uint)local_7e0._0_4_);
                  auVar78 = _local_7c0;
                  auVar253 = local_620;
                  auVar80 = local_610;
                  fVar236 = local_630;
                  fVar214 = fStack_62c;
                  fVar221 = fStack_628;
                  fVar222 = fStack_624;
                }
                else {
                  auVar3 = vsqrtss_avx(auVar3,auVar3);
                  fVar213 = auVar3._0_4_;
                  fVar214 = fVar236;
                  fVar221 = fVar236;
                  fVar222 = fVar236;
                }
                auVar248 = ZEXT1664(auVar78);
                auVar243 = ZEXT1664(local_740._0_16_);
                auVar238 = ZEXT1664(local_720._0_16_);
                auVar254 = ZEXT3264(local_840);
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,auVar76);
                auVar76 = vfmadd231ss_fma(local_780._0_16_,auVar76,SUB6416(ZEXT464(0xc0000000),0));
                auVar195._0_4_ = fVar240 * (float)local_6e0._0_4_;
                auVar195._4_4_ = fVar240 * (float)local_6e0._4_4_;
                auVar195._8_4_ = fVar240 * fStack_6d8;
                auVar195._12_4_ = fVar240 * fStack_6d4;
                auVar211._0_4_ = auVar76._0_4_;
                auVar211._4_4_ = auVar211._0_4_;
                auVar211._8_4_ = auVar211._0_4_;
                auVar211._12_4_ = auVar211._0_4_;
                auVar76 = vfmadd132ps_fma(auVar211,auVar195,local_6a0._0_16_);
                auVar175._0_4_ = auVar3._0_4_;
                auVar175._4_4_ = auVar175._0_4_;
                auVar175._8_4_ = auVar175._0_4_;
                auVar175._12_4_ = auVar175._0_4_;
                auVar76 = vfmadd132ps_fma(auVar175,auVar76,local_6c0._0_16_);
                auVar76 = vfmadd132ps_fma(_local_5a0,auVar76,local_680._0_16_);
                auVar176._0_4_ = auVar76._0_4_ * (float)local_5c0._0_4_;
                auVar176._4_4_ = auVar76._4_4_ * (float)local_5c0._0_4_;
                auVar176._8_4_ = auVar76._8_4_ * (float)local_5c0._0_4_;
                auVar176._12_4_ = auVar76._12_4_ * (float)local_5c0._0_4_;
                auVar76 = vdpps_avx(auVar78,auVar76,0x7f);
                fVar183 = auVar76._0_4_;
                auVar196._0_4_ = auVar78._0_4_ * fVar183;
                auVar196._4_4_ = auVar78._4_4_ * fVar183;
                auVar196._8_4_ = auVar78._8_4_ * fVar183;
                auVar196._12_4_ = auVar78._12_4_ * fVar183;
                auVar76 = vsubps_avx(auVar176,auVar196);
                fVar183 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar82 = vxorps_avx512vl(auVar78,auVar21);
                auVar218._0_4_ = fVar236 * auVar76._0_4_ * fVar183;
                auVar218._4_4_ = fVar214 * auVar76._4_4_ * fVar183;
                auVar218._8_4_ = fVar221 * auVar76._8_4_ * fVar183;
                auVar218._12_4_ = fVar222 * auVar76._12_4_ * fVar183;
                auVar76 = vdpps_avx(auVar82,auVar253,0x7f);
                auVar3 = vmaxss_avx(ZEXT416((uint)fVar235),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * fVar142 * 1.9073486e-06)
                                           ));
                auVar83 = vdivss_avx512f(ZEXT416((uint)fVar235),auVar79);
                auVar79 = vdpps_avx(local_720._0_16_,auVar218,0x7f);
                auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar235),auVar3);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar205 + 1.0)),auVar83,auVar77);
                auVar77 = vdpps_avx(local_6f0,auVar253,0x7f);
                fVar236 = auVar76._0_4_ + auVar79._0_4_;
                auVar76 = vdpps_avx(local_720._0_16_,auVar82,0x7f);
                auVar81 = vmulss_avx512f(auVar81,auVar80);
                auVar80 = vmulss_avx512f(auVar80,auVar80);
                auVar79 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar81 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar81._0_4_ * auVar80._0_4_)));
                auVar80 = vfnmadd231ss_fma(auVar76,auVar74,ZEXT416((uint)fVar236));
                auVar75 = vfnmadd231ss_fma(auVar79,auVar74,auVar77);
                auVar76 = vpermilps_avx(local_580._0_16_,0xff);
                fVar213 = fVar213 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar78,auVar78,0xff);
                auVar79 = vfmsub213ss_fma(auVar80,auVar81,auVar76);
                fVar205 = auVar75._0_4_ * auVar81._0_4_;
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar79._0_4_)),
                                          ZEXT416((uint)fVar236),ZEXT416((uint)fVar205));
                auVar232 = ZEXT1664(auVar80);
                fVar214 = auVar80._0_4_;
                fVar240 = fVar240 - (fVar237 * (fVar205 / fVar214) -
                                    fVar213 * (auVar77._0_4_ / fVar214));
                auVar226 = ZEXT464((uint)fVar240);
                fVar236 = (float)local_7a0._0_4_ -
                          (fVar213 * (fVar236 / fVar214) - fVar237 * (auVar79._0_4_ / fVar214));
                auVar234 = ZEXT464((uint)fVar236);
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(auVar74,auVar22);
              } while (auVar83._0_4_ <= auVar77._0_4_);
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar3._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(ZEXT416((uint)fVar213),auVar23);
            } while (auVar77._0_4_ <= auVar79._0_4_);
            fVar142 = fVar236 + (float)local_650._0_4_;
            if ((((fVar158 <= fVar142) &&
                 (fVar235 = pre->ray_space[2].vy.field_0.m128[(long)ray], fVar142 <= fVar235)) &&
                (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
              auVar197._4_12_ = SUB1612(ZEXT816(0),0);
              auVar197._0_4_ = local_740._0_4_;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar197);
              fVar237 = auVar77._0_4_;
              lVar70 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar160 * 8);
              if ((*(uint *)(lVar70 + 0x34) & (uint)pre->ray_space[2].vz.field_0.m128[(long)ray]) !=
                  0) {
                fVar237 = fVar237 * 1.5 + local_740._0_4_ * -0.5 * fVar237 * fVar237 * fVar237;
                auVar198._0_4_ = local_720._0_4_ * fVar237;
                auVar198._4_4_ = local_720._4_4_ * fVar237;
                auVar198._8_4_ = local_720._8_4_ * fVar237;
                auVar198._12_4_ = local_720._12_4_ * fVar237;
                auVar74 = vfmadd213ps_fma(auVar76,auVar198,auVar78);
                auVar76 = vshufps_avx(auVar198,auVar198,0xc9);
                auVar77 = vshufps_avx(auVar78,auVar78,0xc9);
                auVar199._0_4_ = auVar198._0_4_ * auVar77._0_4_;
                auVar199._4_4_ = auVar198._4_4_ * auVar77._4_4_;
                auVar199._8_4_ = auVar198._8_4_ * auVar77._8_4_;
                auVar199._12_4_ = auVar198._12_4_ * auVar77._12_4_;
                auVar79 = vfmsub231ps_fma(auVar199,auVar78,auVar76);
                auVar76 = vshufps_avx(auVar79,auVar79,0xc9);
                auVar77 = vshufps_avx(auVar74,auVar74,0xc9);
                auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                auVar149._0_4_ = auVar74._0_4_ * auVar79._0_4_;
                auVar149._4_4_ = auVar74._4_4_ * auVar79._4_4_;
                auVar149._8_4_ = auVar74._8_4_ * auVar79._8_4_;
                auVar149._12_4_ = auVar74._12_4_ * auVar79._12_4_;
                auVar76 = vfmsub231ps_fma(auVar149,auVar76,auVar77);
                fVar237 = auVar76._0_4_;
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar70 + 0x40) == 0))
                {
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar142;
                  fVar142 = (float)vextractps_avx(auVar76,1);
                  pre->ray_space[3].vz.field_0.m128[(long)ray] = fVar142;
                  uVar166 = vextractps_avx(auVar76,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x10) = uVar166;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar237;
                  pre[1].ray_space[0].vy.field_0.m128[(long)ray] = fVar240;
                  pre[1].ray_space[0].vz.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[1].vx.field_0.m128[(long)ray] = fVar252;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar160;
                  pre[1].ray_space[1].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[2].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  local_520._0_16_ = vshufps_avx(auVar76,auVar76,0x55);
                  local_520._16_16_ = vshufps_avx(auVar76,auVar76,0xaa);
                  local_500 = fVar237;
                  fStack_4fc = fVar237;
                  fStack_4f8 = fVar237;
                  fStack_4f4 = fVar237;
                  local_4f0 = fVar240;
                  fStack_4ec = fVar240;
                  fStack_4e8 = fVar240;
                  fStack_4e4 = fVar240;
                  local_4e0 = ZEXT416(0) << 0x20;
                  local_4d0 = local_540._0_8_;
                  uStack_4c8 = local_540._8_8_;
                  local_4c0 = local_530;
                  vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                  uStack_4ac = **(undefined4 **)(k + 8);
                  local_4b0 = uStack_4ac;
                  uStack_4a8 = uStack_4ac;
                  uStack_4a4 = uStack_4ac;
                  uStack_4a0 = (*(undefined4 **)(k + 8))[1];
                  uStack_49c = uStack_4a0;
                  uStack_498 = uStack_4a0;
                  uStack_494 = uStack_4a0;
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar142;
                  local_870 = local_550;
                  local_810 = local_870;
                  local_808 = *(undefined8 *)(lVar70 + 0x18);
                  local_800 = *(undefined8 *)(k + 8);
                  local_7f0 = (int *)local_520;
                  local_7e8 = 4;
                  local_7f8 = pre;
                  if (*(code **)(lVar70 + 0x40) != (code *)0x0) {
                    auVar232 = ZEXT1664(auVar80);
                    auVar234 = ZEXT464((uint)fVar236);
                    auVar238 = ZEXT1664(local_720._0_16_);
                    auVar243 = ZEXT1664(local_740._0_16_);
                    auVar248 = ZEXT1664(auVar78);
                    (**(code **)(lVar70 + 0x40))(&local_810);
                    auVar254 = ZEXT3264(local_840);
                  }
                  uVar72 = vptestmd_avx512vl(local_870,local_870);
                  if ((uVar72 & 0xf) != 0) {
                    pcVar4 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar4 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar70 + 0x3e) & 0x40) != 0)))) {
                      auVar232 = ZEXT1664(auVar232._0_16_);
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      auVar248 = ZEXT1664(auVar248._0_16_);
                      (*pcVar4)(&local_810);
                      auVar254 = ZEXT3264(local_840);
                    }
                    uVar72 = vptestmd_avx512vl(local_870,local_870);
                    uVar72 = uVar72 & 0xf;
                    bVar68 = (byte)uVar72;
                    if (bVar68 != 0) {
                      iVar55 = local_7f0[1];
                      iVar56 = local_7f0[2];
                      iVar57 = local_7f0[3];
                      pVVar1 = &local_7f8->ray_space[3].vz;
                      iVar58 = *(int *)((long)&local_7f8->ray_space[3].vz.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8->ray_space[3].vz.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8->ray_space[3].vz.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      (pVVar1->field_0).m128[0] =
                           (float)((uint)(bVar68 & 1) * *local_7f0 |
                                  (uint)!(bool)(bVar68 & 1) * *(int *)&pVVar1->field_0);
                      local_7f8->ray_space[3].vz.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8->ray_space[3].vz.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8->ray_space[3].vz.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      iVar55 = local_7f0[5];
                      iVar56 = local_7f0[6];
                      iVar57 = local_7f0[7];
                      iVar58 = local_7f8[1].depth_scale.field_0.i[1];
                      iVar59 = local_7f8[1].depth_scale.field_0.i[2];
                      iVar60 = local_7f8[1].depth_scale.field_0.i[3];
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      local_7f8[1].depth_scale.field_0.i[0] =
                           (uint)(bVar68 & 1) * local_7f0[4] |
                           (uint)!(bool)(bVar68 & 1) * local_7f8[1].depth_scale.field_0.i[0];
                      local_7f8[1].depth_scale.field_0.i[1] =
                           (uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58;
                      local_7f8[1].depth_scale.field_0.i[2] =
                           (uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59;
                      local_7f8[1].depth_scale.field_0.i[3] =
                           (uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60;
                      iVar55 = local_7f0[9];
                      iVar56 = local_7f0[10];
                      iVar57 = local_7f0[0xb];
                      iVar58 = *(int *)((long)&local_7f8[1].ray_space[0].vx.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8[1].ray_space[0].vx.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8[1].ray_space[0].vx.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      local_7f8[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar68 & 1) * local_7f0[8] |
                                  (uint)!(bool)(bVar68 & 1) *
                                  *(int *)&local_7f8[1].ray_space[0].vx.field_0);
                      local_7f8[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      iVar55 = local_7f0[0xd];
                      iVar56 = local_7f0[0xe];
                      iVar57 = local_7f0[0xf];
                      pVVar1 = &local_7f8[1].ray_space[0].vy;
                      iVar58 = *(int *)((long)&local_7f8[1].ray_space[0].vy.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8[1].ray_space[0].vy.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8[1].ray_space[0].vy.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      (pVVar1->field_0).m128[0] =
                           (float)((uint)(bVar68 & 1) * local_7f0[0xc] |
                                  (uint)!(bool)(bVar68 & 1) * *(int *)&pVVar1->field_0);
                      local_7f8[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      iVar55 = local_7f0[0x11];
                      iVar56 = local_7f0[0x12];
                      iVar57 = local_7f0[0x13];
                      pVVar1 = &local_7f8[1].ray_space[0].vz;
                      iVar58 = *(int *)((long)&local_7f8[1].ray_space[0].vz.field_0 + 4);
                      iVar59 = *(int *)((long)&local_7f8[1].ray_space[0].vz.field_0 + 8);
                      iVar60 = *(int *)((long)&local_7f8[1].ray_space[0].vz.field_0 + 0xc);
                      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar6 = SUB81(uVar72 >> 3,0);
                      (pVVar1->field_0).m128[0] =
                           (float)((uint)(bVar68 & 1) * local_7f0[0x10] |
                                  (uint)!(bool)(bVar68 & 1) * *(int *)&pVVar1->field_0);
                      local_7f8[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar71 * iVar55 | (uint)!bVar71 * iVar58);
                      local_7f8[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar59);
                      local_7f8[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar60);
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x14));
                      local_7f8[1].ray_space[1].vx.field_0 = aVar2;
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x18));
                      local_7f8[1].ray_space[1].vy.field_0 = aVar2;
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x1c));
                      local_7f8[1].ray_space[1].vz.field_0 = aVar2;
                      aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_7f0 + 0x20));
                      local_7f8[1].ray_space[2].vx.field_0 = aVar2;
                      goto LAB_019d5843;
                    }
                  }
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar235;
                }
              }
            }
LAB_019d5843:
            uVar166 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
            auVar225._4_4_ = uVar166;
            auVar225._0_4_ = uVar166;
            auVar225._8_4_ = uVar166;
            auVar225._12_4_ = uVar166;
            auVar225._16_4_ = uVar166;
            auVar225._20_4_ = uVar166;
            auVar225._24_4_ = uVar166;
            auVar225._28_4_ = uVar166;
            auVar226 = ZEXT3264(auVar225);
            auVar62._4_4_ = fStack_3dc;
            auVar62._0_4_ = local_3e0;
            auVar62._8_4_ = fStack_3d8;
            auVar62._12_4_ = fStack_3d4;
            auVar62._16_4_ = fStack_3d0;
            auVar62._20_4_ = fStack_3cc;
            auVar62._24_4_ = fStack_3c8;
            auVar62._28_4_ = fStack_3c4;
            uVar13 = vcmpps_avx512vl(auVar225,auVar62,0xd);
          }
          uVar15 = vpcmpd_avx512vl(local_3a0,local_320,1);
          uVar14 = vpcmpd_avx512vl(local_3a0,_local_400,1);
          auVar179._0_4_ = (float)local_420._0_4_ + (float)local_200._0_4_;
          auVar179._4_4_ = (float)local_420._4_4_ + (float)local_200._4_4_;
          auVar179._8_4_ = fStack_418 + fStack_1f8;
          auVar179._12_4_ = fStack_414 + fStack_1f4;
          auVar179._16_4_ = fStack_410 + fStack_1f0;
          auVar179._20_4_ = fStack_40c + fStack_1ec;
          auVar179._24_4_ = fStack_408 + fStack_1e8;
          auVar179._28_4_ = fStack_404 + fStack_1e4;
          uVar166 = auVar226._0_4_;
          auVar200._4_4_ = uVar166;
          auVar200._0_4_ = uVar166;
          auVar200._8_4_ = uVar166;
          auVar200._12_4_ = uVar166;
          auVar200._16_4_ = uVar166;
          auVar200._20_4_ = uVar166;
          auVar200._24_4_ = uVar166;
          auVar200._28_4_ = uVar166;
          uVar13 = vcmpps_avx512vl(auVar179,auVar200,2);
          bVar69 = (byte)local_84c & (byte)uVar15 & (byte)uVar13;
          auVar212._0_4_ = (float)local_420._0_4_ + (float)local_360._0_4_;
          auVar212._4_4_ = (float)local_420._4_4_ + (float)local_360._4_4_;
          auVar212._8_4_ = fStack_418 + fStack_358;
          auVar212._12_4_ = fStack_414 + fStack_354;
          auVar212._16_4_ = fStack_410 + fStack_350;
          auVar212._20_4_ = fStack_40c + fStack_34c;
          auVar212._24_4_ = fStack_408 + fStack_348;
          auVar212._28_4_ = fStack_404 + fStack_344;
          uVar13 = vcmpps_avx512vl(auVar212,auVar200,2);
          bVar64 = bVar64 & (byte)uVar14 & (byte)uVar13 | bVar69;
          if (bVar64 != 0) {
            abStack_180[uVar66 * 0x60] = bVar64;
            bVar71 = (bool)(bVar69 >> 1 & 1);
            bVar5 = (bool)(bVar69 >> 2 & 1);
            bVar6 = (bool)(bVar69 >> 3 & 1);
            bVar7 = (bool)(bVar69 >> 4 & 1);
            bVar8 = (bool)(bVar69 >> 5 & 1);
            bVar9 = (bool)(bVar69 >> 6 & 1);
            auStack_160[uVar66 * 0x18] =
                 (uint)(bVar69 & 1) * local_200._0_4_ | (uint)!(bool)(bVar69 & 1) * local_360._0_4_;
            auStack_160[uVar66 * 0x18 + 1] =
                 (uint)bVar71 * local_200._4_4_ | (uint)!bVar71 * local_360._4_4_;
            auStack_160[uVar66 * 0x18 + 2] =
                 (uint)bVar5 * (int)fStack_1f8 | (uint)!bVar5 * (int)fStack_358;
            auStack_160[uVar66 * 0x18 + 3] =
                 (uint)bVar6 * (int)fStack_1f4 | (uint)!bVar6 * (int)fStack_354;
            auStack_160[uVar66 * 0x18 + 4] =
                 (uint)bVar7 * (int)fStack_1f0 | (uint)!bVar7 * (int)fStack_350;
            auStack_160[uVar66 * 0x18 + 5] =
                 (uint)bVar8 * (int)fStack_1ec | (uint)!bVar8 * (int)fStack_34c;
            auStack_160[uVar66 * 0x18 + 6] =
                 (uint)bVar9 * (int)fStack_1e8 | (uint)!bVar9 * (int)fStack_348;
            auStack_160[uVar66 * 0x18 + 7] =
                 (uint)(bVar69 >> 7) * (int)fStack_1e4 |
                 (uint)!(bool)(bVar69 >> 7) * (int)fStack_344;
            uVar72 = vmovlps_avx(local_3b0);
            (&uStack_140)[uVar66 * 0xc] = uVar72;
            aiStack_138[uVar66 * 0x18] = local_854 + 1;
            uVar66 = (ulong)((int)uVar66 + 1);
          }
          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar255 = ZEXT3264(auVar86);
          auVar226 = ZEXT3264(_DAT_01f7b040);
          lVar70 = local_758;
          context = local_750;
        }
      }
    }
    do {
      uVar73 = (uint)uVar66;
      uVar66 = (ulong)(uVar73 - 1);
      if (uVar73 == 0) {
        uVar166 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
        auVar29._4_4_ = uVar166;
        auVar29._0_4_ = uVar166;
        auVar29._8_4_ = uVar166;
        auVar29._12_4_ = uVar166;
        auVar29._16_4_ = uVar166;
        auVar29._20_4_ = uVar166;
        auVar29._24_4_ = uVar166;
        auVar29._28_4_ = uVar166;
        uVar13 = vcmpps_avx512vl(local_300,auVar29,2);
        local_748 = (ulong)((uint)local_748 & (uint)uVar13);
        goto LAB_019d32e5;
      }
      auVar86 = *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x18);
      auVar180._0_4_ = auVar86._0_4_ + (float)local_420._0_4_;
      auVar180._4_4_ = auVar86._4_4_ + (float)local_420._4_4_;
      auVar180._8_4_ = auVar86._8_4_ + fStack_418;
      auVar180._12_4_ = auVar86._12_4_ + fStack_414;
      auVar180._16_4_ = auVar86._16_4_ + fStack_410;
      auVar180._20_4_ = auVar86._20_4_ + fStack_40c;
      auVar180._24_4_ = auVar86._24_4_ + fStack_408;
      auVar180._28_4_ = auVar86._28_4_ + fStack_404;
      uVar166 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
      auVar28._4_4_ = uVar166;
      auVar28._0_4_ = uVar166;
      auVar28._8_4_ = uVar166;
      auVar28._12_4_ = uVar166;
      auVar28._16_4_ = uVar166;
      auVar28._20_4_ = uVar166;
      auVar28._24_4_ = uVar166;
      auVar28._28_4_ = uVar166;
      uVar13 = vcmpps_avx512vl(auVar180,auVar28,2);
      uVar135 = (uint)uVar13 & (uint)abStack_180[uVar66 * 0x60];
    } while (uVar135 == 0);
    uVar72 = (&uStack_140)[uVar66 * 0xc];
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar72;
    auVar201._8_4_ = 0x7f800000;
    auVar201._0_8_ = 0x7f8000007f800000;
    auVar201._12_4_ = 0x7f800000;
    auVar201._16_4_ = 0x7f800000;
    auVar201._20_4_ = 0x7f800000;
    auVar201._24_4_ = 0x7f800000;
    auVar201._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar201,auVar86);
    bVar64 = (byte)uVar135;
    auVar134._0_4_ =
         (uint)(bVar64 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)auVar86._0_4_;
    bVar71 = (bool)((byte)(uVar135 >> 1) & 1);
    auVar134._4_4_ = (uint)bVar71 * auVar84._4_4_ | (uint)!bVar71 * (int)auVar86._4_4_;
    bVar71 = (bool)((byte)(uVar135 >> 2) & 1);
    auVar134._8_4_ = (uint)bVar71 * auVar84._8_4_ | (uint)!bVar71 * (int)auVar86._8_4_;
    bVar71 = (bool)((byte)(uVar135 >> 3) & 1);
    auVar134._12_4_ = (uint)bVar71 * auVar84._12_4_ | (uint)!bVar71 * (int)auVar86._12_4_;
    bVar71 = (bool)((byte)(uVar135 >> 4) & 1);
    auVar134._16_4_ = (uint)bVar71 * auVar84._16_4_ | (uint)!bVar71 * (int)auVar86._16_4_;
    bVar71 = (bool)((byte)(uVar135 >> 5) & 1);
    auVar134._20_4_ = (uint)bVar71 * auVar84._20_4_ | (uint)!bVar71 * (int)auVar86._20_4_;
    bVar71 = (bool)((byte)(uVar135 >> 6) & 1);
    auVar134._24_4_ = (uint)bVar71 * auVar84._24_4_ | (uint)!bVar71 * (int)auVar86._24_4_;
    auVar134._28_4_ =
         (uVar135 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar135 >> 7,0) * (int)auVar86._28_4_;
    auVar86 = vshufps_avx(auVar134,auVar134,0xb1);
    auVar86 = vminps_avx(auVar134,auVar86);
    auVar84 = vshufpd_avx(auVar86,auVar86,5);
    auVar86 = vminps_avx(auVar86,auVar84);
    auVar84 = vpermpd_avx2(auVar86,0x4e);
    auVar86 = vminps_avx(auVar86,auVar84);
    uVar13 = vcmpps_avx512vl(auVar134,auVar86,0);
    bVar69 = (byte)uVar13 & bVar64;
    if (bVar69 != 0) {
      uVar135 = (uint)bVar69;
    }
    uVar136 = 0;
    for (; (uVar135 & 1) == 0; uVar135 = uVar135 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_854 = aiStack_138[uVar66 * 0x18];
    bVar64 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar64;
    abStack_180[uVar66 * 0x60] = bVar64;
    if (bVar64 == 0) {
      uVar73 = uVar73 - 1;
    }
    uVar166 = (undefined4)uVar72;
    auVar157._4_4_ = uVar166;
    auVar157._0_4_ = uVar166;
    auVar157._8_4_ = uVar166;
    auVar157._12_4_ = uVar166;
    auVar157._16_4_ = uVar166;
    auVar157._20_4_ = uVar166;
    auVar157._24_4_ = uVar166;
    auVar157._28_4_ = uVar166;
    auVar76 = vmovshdup_avx(auVar177);
    auVar76 = vsubps_avx(auVar76,auVar177);
    auVar181._0_4_ = auVar76._0_4_;
    auVar181._4_4_ = auVar181._0_4_;
    auVar181._8_4_ = auVar181._0_4_;
    auVar181._12_4_ = auVar181._0_4_;
    auVar181._16_4_ = auVar181._0_4_;
    auVar181._20_4_ = auVar181._0_4_;
    auVar181._24_4_ = auVar181._0_4_;
    auVar181._28_4_ = auVar181._0_4_;
    auVar76 = vfmadd132ps_fma(auVar181,auVar157,auVar226._0_32_);
    local_520 = ZEXT1632(auVar76);
    local_3b0._8_8_ = 0;
    local_3b0._0_8_ = *(ulong *)(local_520 + (ulong)uVar136 * 4);
    uVar66 = (ulong)uVar73;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }